

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O0

void capnp::_::anon_unknown_130::dynamicCheckTestMessage<capnp::DynamicStruct::Reader>
               (Reader reader)

{
  StringPtr name;
  StringPtr name_00;
  StringPtr name_01;
  StringPtr name_02;
  StringPtr name_03;
  StringPtr name_04;
  StringPtr name_05;
  StringPtr name_06;
  StringPtr name_07;
  StringPtr name_08;
  StringPtr name_09;
  StringPtr name_10;
  StringPtr name_11;
  StringPtr name_12;
  StringPtr name_13;
  StringPtr name_14;
  StringPtr name_15;
  StringPtr name_16;
  StringPtr name_17;
  StringPtr name_18;
  StringPtr name_19;
  StringPtr name_20;
  StringPtr name_21;
  StringPtr name_22;
  StringPtr name_23;
  bool bVar1;
  ReaderFor<bool> RVar2;
  ReaderFor<signed_char> RVar3;
  ReaderFor<unsigned_char> RVar4;
  ReaderFor<short> RVar5;
  ReaderFor<unsigned_short> RVar6;
  ReaderFor<int> RVar7;
  ReaderFor<unsigned_int> RVar8;
  uint uVar9;
  ReaderFor<long> RVar10;
  ReaderFor<unsigned_long> RVar11;
  ReaderFor<float> RVar12;
  float fVar13;
  ReaderFor<double> RVar14;
  ArrayPtr<const_char> AVar15;
  ArrayPtr<const_unsigned_char> AVar16;
  ReaderFor<capnp::DynamicEnum> RVar17;
  Reader RVar18;
  DynamicEnum e;
  DynamicEnum e_00;
  DynamicEnum e_01;
  DynamicEnum e_02;
  initializer_list<capnp::Void> expected;
  initializer_list<bool> expected_00;
  initializer_list<signed_char> expected_01;
  initializer_list<short> expected_02;
  initializer_list<int> expected_03;
  initializer_list<long> expected_04;
  initializer_list<unsigned_char> expected_05;
  initializer_list<unsigned_short> expected_06;
  initializer_list<unsigned_int> expected_07;
  initializer_list<unsigned_long> expected_08;
  initializer_list<float> expected_09;
  initializer_list<double> expected_10;
  initializer_list<capnp::Text::Reader> expected_11;
  initializer_list<capnp::Data::Reader> expected_12;
  initializer_list<const_char_*> expected_13;
  initializer_list<bool> expected_14;
  initializer_list<signed_char> expected_15;
  initializer_list<short> expected_16;
  initializer_list<int> expected_17;
  initializer_list<long> expected_18;
  initializer_list<unsigned_char> expected_19;
  initializer_list<unsigned_short> expected_20;
  initializer_list<unsigned_int> expected_21;
  initializer_list<unsigned_long> expected_22;
  initializer_list<capnp::Text::Reader> expected_23;
  initializer_list<capnp::Data::Reader> expected_24;
  initializer_list<const_char_*> expected_25;
  char *local_3c68;
  char *local_3c60;
  undefined8 local_3c58;
  undefined8 local_3c50;
  StringPtr local_3c48;
  Reader local_3c38;
  ArrayPtr<const_char> local_3bf0;
  Reader local_3be0;
  ReaderFor<capnp::DynamicStruct> local_3b98;
  Reader local_3b60;
  ArrayPtr<const_char> local_3b18;
  bool local_3b01;
  undefined1 auStack_3b00 [7];
  bool _kj_shouldLog_46;
  Reader local_3af0;
  ReaderFor<capnp::DynamicStruct> local_3aa8;
  Reader local_3a70;
  ArrayPtr<const_char> local_3a28;
  ArrayPtr<const_char> local_3a18;
  Reader local_3a08;
  ReaderFor<capnp::DynamicStruct> local_39c0;
  Reader local_3988;
  ArrayPtr<const_char> local_3940;
  bool local_3929;
  undefined1 auStack_3928 [7];
  bool _kj_shouldLog_45;
  Reader local_3918;
  ReaderFor<capnp::DynamicStruct> local_38d0;
  Reader local_3898;
  ArrayPtr<const_char> local_3850;
  ArrayPtr<const_char> local_3840;
  Reader local_3830;
  ReaderFor<capnp::DynamicStruct> local_37e8;
  Reader local_37b0;
  ArrayPtr<const_char> local_3768;
  bool local_3751;
  undefined1 auStack_3750 [7];
  bool _kj_shouldLog_44;
  Reader local_3740;
  ReaderFor<capnp::DynamicStruct> local_36f8;
  Reader local_36c0;
  ArrayPtr<const_char> local_3678;
  uint local_3668;
  uint local_3664;
  Fault local_3660;
  Fault f_3;
  Reader local_3648;
  undefined1 local_3600 [8];
  ReaderFor<capnp::DynamicList> listReader_3;
  ArrayPtr<const_char> local_3580;
  Reader local_3570;
  undefined1 local_3528 [32];
  Reader local_3508 [2];
  StringPtr local_34e8;
  Reader local_34d8;
  bool local_3489;
  undefined1 local_3488 [7];
  bool _kj_shouldLog_43;
  Reader local_3440;
  ReaderFor<double> local_33f8;
  float local_33f0;
  bool local_33e9;
  undefined1 local_33e8 [7];
  bool _kj_shouldLog_42;
  Reader local_33a0;
  ReaderFor<double> local_3358;
  float local_3350;
  bool local_3349;
  undefined1 local_3348 [7];
  bool _kj_shouldLog_41;
  Reader local_3300;
  ReaderFor<double> local_32b8;
  double local_32b0;
  bool local_32a1;
  undefined1 local_32a0 [7];
  bool _kj_shouldLog_40;
  uint local_3258;
  uint local_3254;
  Fault local_3250;
  Fault f_2;
  Reader local_3238;
  undefined1 local_31f0 [8];
  ReaderFor<capnp::DynamicList> listReader_2;
  undefined1 local_31a8 [7];
  bool _kj_shouldLog_39;
  Reader local_3160;
  ReaderFor<float> local_3114;
  float local_3110;
  bool local_3109;
  undefined1 local_3108 [7];
  bool _kj_shouldLog_38;
  Reader local_30c0;
  ReaderFor<float> local_3074;
  float local_3070;
  bool local_3069;
  undefined1 local_3068 [7];
  bool _kj_shouldLog_37;
  Reader local_3020;
  ReaderFor<float> local_2fd4;
  float local_2fd0;
  bool local_2fc9;
  undefined1 local_2fc8 [7];
  bool _kj_shouldLog_36;
  uint local_2f80;
  uint local_2f7c;
  Fault local_2f78;
  Fault f_1;
  Reader local_2f60;
  undefined1 local_2f18 [8];
  ReaderFor<capnp::DynamicList> listReader_1;
  StringPtr local_2ec0;
  Reader local_2eb0;
  undefined1 local_2e64 [20];
  StringPtr local_2e50;
  Reader local_2e40;
  undefined1 local_2df4 [20];
  StringPtr local_2de0;
  Reader local_2dd0;
  undefined1 local_2d82 [18];
  StringPtr local_2d70;
  Reader local_2d60;
  undefined1 local_2d18 [48];
  Reader local_2ce8;
  undefined1 local_2ca0 [40];
  Reader local_2c78;
  undefined1 local_2c2c [20];
  StringPtr local_2c18;
  Reader local_2c08;
  undefined1 local_2bba [18];
  StringPtr local_2ba8;
  Reader local_2b98;
  undefined1 local_2b4c [20];
  StringPtr local_2b38;
  Reader local_2b28;
  ArrayPtr<const_char> local_2ae0;
  Reader local_2ad0;
  ReaderFor<capnp::DynamicList> local_2a88;
  uint local_2a44;
  uint local_2a40;
  bool local_2a39;
  undefined1 auStack_2a38 [7];
  bool _kj_shouldLog_35;
  Reader local_2a28;
  ReaderFor<capnp::DynamicList> local_29e0;
  Schema local_29a0;
  uint16_t local_2998;
  ArrayPtr<const_char> local_2990;
  Reader local_2980;
  Schema local_2938;
  uint local_2930;
  ArrayPtr<const_char> local_2928;
  bool local_2911;
  Schema SStack_2910;
  bool _kj_shouldLog_34;
  uint16_t local_2908;
  ArrayPtr<const_char> local_2900;
  Reader local_28f0;
  Schema local_28a8;
  uint local_28a0;
  ArrayPtr<const_char> local_2898;
  char *local_2888;
  undefined1 auStack_2880 [32];
  StringPtr local_2860;
  Reader local_2850;
  ArrayPtr<const_char> local_2808;
  Reader local_27f8;
  ReaderFor<capnp::DynamicStruct> local_27b0;
  Reader local_2778;
  ArrayPtr<const_char> local_2730;
  bool local_2719;
  undefined1 auStack_2718 [7];
  bool _kj_shouldLog_33;
  Reader local_2708;
  ReaderFor<capnp::DynamicStruct> local_26c0;
  Reader local_2688;
  ArrayPtr<const_char> local_2640;
  ArrayPtr<const_char> local_2630;
  Reader local_2620;
  ReaderFor<capnp::DynamicStruct> local_25d8;
  Reader local_25a0;
  ArrayPtr<const_char> local_2558;
  bool local_2541;
  undefined1 auStack_2540 [7];
  bool _kj_shouldLog_32;
  Reader local_2530;
  ReaderFor<capnp::DynamicStruct> local_24e8;
  Reader local_24b0;
  ArrayPtr<const_char> local_2468;
  ArrayPtr<const_char> local_2458;
  Reader local_2448;
  ReaderFor<capnp::DynamicStruct> local_2400;
  Reader local_23c8;
  ArrayPtr<const_char> local_2380;
  bool local_2369;
  undefined1 auStack_2368 [7];
  bool _kj_shouldLog_31;
  Reader local_2358;
  ReaderFor<capnp::DynamicStruct> local_2310;
  Reader local_22d8;
  ArrayPtr<const_char> local_2290;
  uint local_2280;
  uint local_227c;
  Fault local_2278;
  Fault f;
  Reader local_2260;
  undefined1 local_2218 [8];
  ReaderFor<capnp::DynamicList> listReader;
  ArrayPtr<const_char> local_2198;
  Reader local_2188;
  undefined1 local_2140 [32];
  Reader local_2120 [2];
  StringPtr local_2100;
  Reader local_20f0;
  Reader local_20a8;
  StringPtr local_2060;
  Reader local_2050;
  undefined1 local_2008 [56];
  Reader local_1fd0;
  undefined1 local_1f88 [64];
  Reader local_1f48;
  undefined1 local_1f00 [48];
  Reader local_1ed0;
  undefined1 local_1e88 [40];
  Reader local_1e60;
  undefined1 local_1e14 [20];
  StringPtr local_1e00;
  Reader local_1df0;
  undefined1 local_1da8 [64];
  Reader local_1d68;
  undefined1 local_1d20 [48];
  Reader local_1cf0;
  undefined1 local_1ca8 [40];
  Reader local_1c80;
  undefined1 local_1c34 [20];
  StringPtr local_1c20;
  Reader local_1c10;
  undefined1 local_1bc5 [21];
  StringPtr local_1bb0;
  Reader local_1ba0;
  undefined1 local_1b53 [19];
  StringPtr local_1b40;
  Reader local_1b30;
  Schema local_1ae8;
  uint16_t local_1ae0;
  ArrayPtr<const_char> local_1ad8;
  Reader local_1ac8;
  Schema local_1a80;
  uint local_1a78;
  ArrayPtr<const_char> local_1a70;
  bool local_1a59;
  Schema SStack_1a58;
  bool _kj_shouldLog_30;
  uint16_t local_1a50;
  ArrayPtr<const_char> local_1a48;
  Reader local_1a38;
  Schema local_19f0;
  uint local_19e8;
  ArrayPtr<const_char> local_19e0;
  ArrayPtr<const_char> local_19d0;
  ArrayPtr<const_char> local_19c0;
  Reader local_19b0;
  ReaderFor<capnp::DynamicStruct> local_1968;
  Reader local_1930;
  ArrayPtr<const_char> local_18e8;
  bool local_18d1;
  undefined1 auStack_18d0 [7];
  bool _kj_shouldLog_29;
  ArrayPtr<const_char> local_18c0;
  Reader local_18b0;
  ReaderFor<capnp::DynamicStruct> local_1868;
  Reader local_1830;
  ArrayPtr<const_char> local_17e8;
  ArrayPtr<const_char> local_17d8;
  Reader local_17c8;
  ArrayPtr<const_char> local_1780;
  bool local_1769;
  undefined1 auStack_1768 [7];
  bool _kj_shouldLog_28;
  Reader local_1758;
  ArrayPtr<const_char> local_1710;
  ArrayPtr<const_char> local_1700;
  Reader local_16f0;
  undefined1 local_16a8 [8];
  ReaderFor<capnp::DynamicStruct> subSubReader;
  Reader local_1660;
  ArrayPtr<const_unsigned_char> local_1618;
  ArrayPtr<const_unsigned_char> local_1608;
  bool local_15f1;
  undefined1 auStack_15f0 [7];
  bool _kj_shouldLog_27;
  Reader local_15e0;
  ArrayPtr<const_unsigned_char> local_1598;
  ArrayPtr<const_unsigned_char> local_1588;
  ArrayPtr<const_char> local_1578;
  Reader local_1568;
  ArrayPtr<const_char> local_1520;
  bool local_1509;
  undefined1 auStack_1508 [7];
  bool _kj_shouldLog_26;
  Reader local_14f8;
  ArrayPtr<const_char> local_14b0;
  int local_149c;
  ArrayPtr<const_char> local_1498;
  Reader local_1488;
  ReaderFor<double> local_1440;
  bool local_1431;
  undefined1 auStack_1430 [7];
  bool _kj_shouldLog_25;
  Reader local_1420;
  float local_13d4;
  ArrayPtr<const_char> local_13d0;
  Reader local_13c0;
  ReaderFor<float> local_1378;
  bool local_1371;
  undefined1 auStack_1370 [7];
  bool _kj_shouldLog_24;
  Reader local_1360;
  ArrayPtr<const_char> local_1318;
  Reader local_1308;
  ReaderFor<unsigned_long> local_12c0;
  unsigned_long_long local_12b8;
  bool local_12a9;
  undefined1 auStack_12a8 [7];
  bool _kj_shouldLog_23;
  Reader local_1298;
  ArrayPtr<const_char> local_1250;
  Reader local_1240;
  ReaderFor<unsigned_int> local_11f4;
  uint local_11f0;
  bool local_11e9;
  undefined1 auStack_11e8 [7];
  bool _kj_shouldLog_22;
  Reader local_11d8;
  ArrayPtr<const_char> local_1190;
  Reader local_1180;
  ReaderFor<unsigned_short> local_1132;
  uint local_1130;
  bool local_1129;
  undefined1 auStack_1128 [7];
  bool _kj_shouldLog_21;
  Reader local_1118;
  ArrayPtr<const_char> local_10d0;
  Reader local_10c0;
  ReaderFor<unsigned_char> local_1071;
  uint local_1070;
  bool local_1069;
  undefined1 auStack_1068 [7];
  bool _kj_shouldLog_20;
  Reader local_1058;
  ArrayPtr<const_char> local_1010;
  Reader local_1000;
  ReaderFor<long> local_fb8;
  longlong local_fb0;
  bool local_fa1;
  undefined1 auStack_fa0 [7];
  bool _kj_shouldLog_19;
  Reader local_f90;
  ArrayPtr<const_char> local_f48;
  Reader local_f38;
  ReaderFor<int> local_eec;
  int local_ee8;
  bool local_ee1;
  undefined1 auStack_ee0 [7];
  bool _kj_shouldLog_18;
  Reader local_ed0;
  ArrayPtr<const_char> local_e88;
  Reader local_e78;
  ReaderFor<short> local_e2a;
  int local_e28;
  bool local_e21;
  undefined1 auStack_e20 [7];
  bool _kj_shouldLog_17;
  Reader local_e10;
  ArrayPtr<const_char> local_dc8;
  Reader local_db8;
  ReaderFor<signed_char> local_d69;
  int local_d68;
  bool local_d61;
  undefined1 auStack_d60 [7];
  bool _kj_shouldLog_16;
  Reader local_d50;
  ArrayPtr<const_char> local_d08;
  Reader local_cf8;
  bool local_cab;
  bool local_caa;
  bool local_ca9;
  undefined1 auStack_ca8 [7];
  bool _kj_shouldLog_15;
  Reader local_c98;
  ArrayPtr<const_char> local_c48;
  Reader local_c38;
  Void local_beb;
  bool local_bea;
  undefined1 auStack_be8 [6];
  bool _kj_shouldLog_14;
  Reader local_bd8;
  ArrayPtr<const_char> local_b88;
  Reader local_b78;
  undefined1 local_b30 [8];
  ReaderFor<capnp::DynamicStruct> subReader;
  Reader local_ae8;
  ArrayPtr<const_unsigned_char> local_aa0;
  ArrayPtr<const_unsigned_char> local_a90;
  bool local_a79;
  undefined1 auStack_a78 [7];
  bool _kj_shouldLog_13;
  Reader local_a68;
  ArrayPtr<const_unsigned_char> local_a20;
  ArrayPtr<const_unsigned_char> local_a10;
  ArrayPtr<const_char> local_a00;
  Reader local_9f0;
  ArrayPtr<const_char> local_9a8;
  bool local_991;
  undefined1 auStack_990 [7];
  bool _kj_shouldLog_12;
  Reader local_980;
  ArrayPtr<const_char> local_938;
  double local_928;
  ArrayPtr<const_char> local_920;
  Reader local_910;
  ReaderFor<double> local_8c8;
  bool local_8b9;
  undefined1 auStack_8b8 [7];
  bool _kj_shouldLog_11;
  Reader local_8a8;
  float local_85c;
  ArrayPtr<const_char> local_858;
  Reader local_848;
  ReaderFor<float> local_800;
  bool local_7f9;
  undefined1 auStack_7f8 [7];
  bool _kj_shouldLog_10;
  Reader local_7e8;
  ArrayPtr<const_char> local_7a0;
  Reader local_790;
  ReaderFor<unsigned_long> local_748;
  unsigned_long_long local_740;
  bool local_731;
  undefined1 auStack_730 [7];
  bool _kj_shouldLog_9;
  Reader local_720;
  ArrayPtr<const_char> local_6d8;
  Reader local_6c8;
  ReaderFor<unsigned_int> local_67c;
  uint local_678;
  bool local_671;
  undefined1 auStack_670 [7];
  bool _kj_shouldLog_8;
  Reader local_660;
  ArrayPtr<const_char> local_618;
  Reader local_608;
  ReaderFor<unsigned_short> local_5ba;
  uint local_5b8;
  bool local_5b1;
  undefined1 auStack_5b0 [7];
  bool _kj_shouldLog_7;
  Reader local_5a0;
  ArrayPtr<const_char> local_558;
  Reader local_548;
  ReaderFor<unsigned_char> local_4f9;
  uint local_4f8;
  bool local_4f1;
  undefined1 auStack_4f0 [7];
  bool _kj_shouldLog_6;
  Reader local_4e0;
  ArrayPtr<const_char> local_498;
  Reader local_488;
  ReaderFor<long> local_440;
  longlong local_438;
  bool local_429;
  undefined1 auStack_428 [7];
  bool _kj_shouldLog_5;
  Reader local_418;
  ArrayPtr<const_char> local_3d0;
  Reader local_3c0;
  ReaderFor<int> local_374;
  int local_370;
  bool local_369;
  undefined1 auStack_368 [7];
  bool _kj_shouldLog_4;
  Reader local_358;
  ArrayPtr<const_char> local_310;
  Reader local_300;
  ReaderFor<short> local_2b2;
  int local_2b0;
  bool local_2a9;
  undefined1 auStack_2a8 [7];
  bool _kj_shouldLog_3;
  Reader local_298;
  ArrayPtr<const_char> local_250;
  Reader local_240;
  ReaderFor<signed_char> local_1f1;
  int local_1f0;
  bool local_1e9;
  undefined1 auStack_1e8 [7];
  bool _kj_shouldLog_2;
  Reader local_1d8;
  ArrayPtr<const_char> local_190;
  Reader local_180;
  bool local_133;
  bool local_132;
  bool local_131;
  undefined1 auStack_130 [7];
  bool _kj_shouldLog_1;
  Reader local_120;
  ArrayPtr<const_char> local_d0;
  Reader local_c0;
  Void local_77;
  bool local_76;
  bool _kj_shouldLog;
  ArrayPtr<const_char> local_68;
  Reader local_58;
  
  kj::StringPtr::StringPtr((StringPtr *)&local_68,"voidField");
  DynamicStruct::Reader::get(&local_58,(Reader *)&stack0x00000008,(StringPtr)local_68);
  DynamicValue::Reader::as<capnp::Void>(&local_58);
  bVar1 = Void::operator==((Void *)&VOID);
  DynamicValue::Reader::~Reader(&local_58);
  if (!bVar1) {
    local_76 = kj::_::Debug::shouldLog(ERROR);
    while (local_76 != false) {
      kj::StringPtr::StringPtr((StringPtr *)&local_d0,"voidField");
      DynamicStruct::Reader::get(&local_c0,(Reader *)&stack0x00000008,(StringPtr)local_d0);
      DynamicValue::Reader::as<capnp::Void>(&local_c0);
      kj::_::Debug::log<char_const(&)[73],capnp::Void_const&,capnp::Void>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x152,ERROR,
                 "\"failed: expected \" \"(VOID) == (reader.get(\\\"voidField\\\").template as<Void>())\", VOID, reader.get(\"voidField\").template as<Void>()"
                 ,(char (*) [73])
                  "failed: expected (VOID) == (reader.get(\"voidField\").template as<Void>())",
                 (Void *)&VOID,&local_77);
      DynamicValue::Reader::~Reader(&local_c0);
      local_76 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_130,"boolField");
  DynamicStruct::Reader::get(&local_120,(Reader *)&stack0x00000008,(StringPtr)_auStack_130);
  RVar2 = DynamicValue::Reader::as<bool>(&local_120);
  DynamicValue::Reader::~Reader(&local_120);
  if (!RVar2) {
    local_131 = kj::_::Debug::shouldLog(ERROR);
    while (local_131 != false) {
      local_132 = true;
      kj::StringPtr::StringPtr((StringPtr *)&local_190,"boolField");
      DynamicStruct::Reader::get(&local_180,(Reader *)&stack0x00000008,(StringPtr)local_190);
      local_133 = DynamicValue::Reader::as<bool>(&local_180);
      kj::_::Debug::log<char_const(&)[73],bool,bool>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x153,ERROR,
                 "\"failed: expected \" \"(true) == (reader.get(\\\"boolField\\\").template as<bool>())\", true, reader.get(\"boolField\").template as<bool>()"
                 ,(char (*) [73])
                  "failed: expected (true) == (reader.get(\"boolField\").template as<bool>())",
                 &local_132,&local_133);
      DynamicValue::Reader::~Reader(&local_180);
      local_131 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_1e8,"int8Field");
  DynamicStruct::Reader::get(&local_1d8,(Reader *)&stack0x00000008,(StringPtr)_auStack_1e8);
  RVar3 = DynamicValue::Reader::as<signed_char>(&local_1d8);
  DynamicValue::Reader::~Reader(&local_1d8);
  if (RVar3 != -0x7b) {
    local_1e9 = kj::_::Debug::shouldLog(ERROR);
    while (local_1e9 != false) {
      local_1f0 = -0x7b;
      kj::StringPtr::StringPtr((StringPtr *)&local_250,"int8Field");
      DynamicStruct::Reader::get(&local_240,(Reader *)&stack0x00000008,(StringPtr)local_250);
      local_1f1 = DynamicValue::Reader::as<signed_char>(&local_240);
      kj::_::Debug::log<char_const(&)[75],int,signed_char>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x154,ERROR,
                 "\"failed: expected \" \"(-123) == (reader.get(\\\"int8Field\\\").template as<int8_t>())\", -123, reader.get(\"int8Field\").template as<int8_t>()"
                 ,(char (*) [75])
                  "failed: expected (-123) == (reader.get(\"int8Field\").template as<int8_t>())",
                 &local_1f0,&local_1f1);
      DynamicValue::Reader::~Reader(&local_240);
      local_1e9 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_2a8,"int16Field");
  DynamicStruct::Reader::get(&local_298,(Reader *)&stack0x00000008,(StringPtr)_auStack_2a8);
  RVar5 = DynamicValue::Reader::as<short>(&local_298);
  DynamicValue::Reader::~Reader(&local_298);
  if (RVar5 != -0x3039) {
    local_2a9 = kj::_::Debug::shouldLog(ERROR);
    while (local_2a9 != false) {
      local_2b0 = -0x3039;
      kj::StringPtr::StringPtr((StringPtr *)&local_310,"int16Field");
      DynamicStruct::Reader::get(&local_300,(Reader *)&stack0x00000008,(StringPtr)local_310);
      local_2b2 = DynamicValue::Reader::as<short>(&local_300);
      kj::_::Debug::log<char_const(&)[79],int,short>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x155,ERROR,
                 "\"failed: expected \" \"(-12345) == (reader.get(\\\"int16Field\\\").template as<int16_t>())\", -12345, reader.get(\"int16Field\").template as<int16_t>()"
                 ,(char (*) [79])
                  "failed: expected (-12345) == (reader.get(\"int16Field\").template as<int16_t>())"
                 ,&local_2b0,&local_2b2);
      DynamicValue::Reader::~Reader(&local_300);
      local_2a9 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_368,"int32Field");
  DynamicStruct::Reader::get(&local_358,(Reader *)&stack0x00000008,(StringPtr)_auStack_368);
  RVar7 = DynamicValue::Reader::as<int>(&local_358);
  DynamicValue::Reader::~Reader(&local_358);
  if (RVar7 != -0xbc614e) {
    local_369 = kj::_::Debug::shouldLog(ERROR);
    while (local_369 != false) {
      local_370 = -0xbc614e;
      kj::StringPtr::StringPtr((StringPtr *)&local_3d0,"int32Field");
      DynamicStruct::Reader::get(&local_3c0,(Reader *)&stack0x00000008,(StringPtr)local_3d0);
      local_374 = DynamicValue::Reader::as<int>(&local_3c0);
      kj::_::Debug::log<char_const(&)[82],int,int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x156,ERROR,
                 "\"failed: expected \" \"(-12345678) == (reader.get(\\\"int32Field\\\").template as<int32_t>())\", -12345678, reader.get(\"int32Field\").template as<int32_t>()"
                 ,(char (*) [82])
                  "failed: expected (-12345678) == (reader.get(\"int32Field\").template as<int32_t>())"
                 ,&local_370,&local_374);
      DynamicValue::Reader::~Reader(&local_3c0);
      local_369 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_428,"int64Field");
  DynamicStruct::Reader::get(&local_418,(Reader *)&stack0x00000008,(StringPtr)_auStack_428);
  RVar10 = DynamicValue::Reader::as<long>(&local_418);
  DynamicValue::Reader::~Reader(&local_418);
  if (RVar10 != -0x7048860ddf79) {
    local_429 = kj::_::Debug::shouldLog(ERROR);
    while (local_429 != false) {
      local_438 = -0x7048860ddf79;
      kj::StringPtr::StringPtr((StringPtr *)&local_498,"int64Field");
      DynamicStruct::Reader::get(&local_488,(Reader *)&stack0x00000008,(StringPtr)local_498);
      local_440 = DynamicValue::Reader::as<long>(&local_488);
      kj::_::Debug::log<char_const(&)[91],long_long,long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x157,ERROR,
                 "\"failed: expected \" \"(-123456789012345ll) == (reader.get(\\\"int64Field\\\").template as<int64_t>())\", -123456789012345ll, reader.get(\"int64Field\").template as<int64_t>()"
                 ,(char (*) [91])
                  "failed: expected (-123456789012345ll) == (reader.get(\"int64Field\").template as<int64_t>())"
                 ,&local_438,&local_440);
      DynamicValue::Reader::~Reader(&local_488);
      local_429 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_4f0,"uInt8Field");
  DynamicStruct::Reader::get(&local_4e0,(Reader *)&stack0x00000008,(StringPtr)_auStack_4f0);
  RVar4 = DynamicValue::Reader::as<unsigned_char>(&local_4e0);
  DynamicValue::Reader::~Reader(&local_4e0);
  if (RVar4 != 0xea) {
    local_4f1 = kj::_::Debug::shouldLog(ERROR);
    while (local_4f1 != false) {
      local_4f8 = 0xea;
      kj::StringPtr::StringPtr((StringPtr *)&local_558,"uInt8Field");
      DynamicStruct::Reader::get(&local_548,(Reader *)&stack0x00000008,(StringPtr)local_558);
      local_4f9 = DynamicValue::Reader::as<unsigned_char>(&local_548);
      kj::_::Debug::log<char_const(&)[77],unsigned_int,unsigned_char>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x158,ERROR,
                 "\"failed: expected \" \"(234u) == (reader.get(\\\"uInt8Field\\\").template as<uint8_t>())\", 234u, reader.get(\"uInt8Field\").template as<uint8_t>()"
                 ,(char (*) [77])
                  "failed: expected (234u) == (reader.get(\"uInt8Field\").template as<uint8_t>())",
                 &local_4f8,&local_4f9);
      DynamicValue::Reader::~Reader(&local_548);
      local_4f1 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_5b0,"uInt16Field");
  DynamicStruct::Reader::get(&local_5a0,(Reader *)&stack0x00000008,(StringPtr)_auStack_5b0);
  RVar6 = DynamicValue::Reader::as<unsigned_short>(&local_5a0);
  DynamicValue::Reader::~Reader(&local_5a0);
  if (RVar6 != 0xb26e) {
    local_5b1 = kj::_::Debug::shouldLog(ERROR);
    while (local_5b1 != false) {
      local_5b8 = 0xb26e;
      kj::StringPtr::StringPtr((StringPtr *)&local_618,"uInt16Field");
      DynamicStruct::Reader::get(&local_608,(Reader *)&stack0x00000008,(StringPtr)local_618);
      local_5ba = DynamicValue::Reader::as<unsigned_short>(&local_608);
      kj::_::Debug::log<char_const(&)[81],unsigned_int,unsigned_short>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x159,ERROR,
                 "\"failed: expected \" \"(45678u) == (reader.get(\\\"uInt16Field\\\").template as<uint16_t>())\", 45678u, reader.get(\"uInt16Field\").template as<uint16_t>()"
                 ,(char (*) [81])
                  "failed: expected (45678u) == (reader.get(\"uInt16Field\").template as<uint16_t>())"
                 ,&local_5b8,&local_5ba);
      DynamicValue::Reader::~Reader(&local_608);
      local_5b1 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_670,"uInt32Field");
  DynamicStruct::Reader::get(&local_660,(Reader *)&stack0x00000008,(StringPtr)_auStack_670);
  RVar8 = DynamicValue::Reader::as<unsigned_int>(&local_660);
  DynamicValue::Reader::~Reader(&local_660);
  if (RVar8 != 0xce0a6a14) {
    local_671 = kj::_::Debug::shouldLog(ERROR);
    while (local_671 != false) {
      local_678 = 0xce0a6a14;
      kj::StringPtr::StringPtr((StringPtr *)&local_6d8,"uInt32Field");
      DynamicStruct::Reader::get(&local_6c8,(Reader *)&stack0x00000008,(StringPtr)local_6d8);
      local_67c = DynamicValue::Reader::as<unsigned_int>(&local_6c8);
      kj::_::Debug::log<char_const(&)[86],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x15a,ERROR,
                 "\"failed: expected \" \"(3456789012u) == (reader.get(\\\"uInt32Field\\\").template as<uint32_t>())\", 3456789012u, reader.get(\"uInt32Field\").template as<uint32_t>()"
                 ,(char (*) [86])
                  "failed: expected (3456789012u) == (reader.get(\"uInt32Field\").template as<uint32_t>())"
                 ,&local_678,&local_67c);
      DynamicValue::Reader::~Reader(&local_6c8);
      local_671 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_730,"uInt64Field");
  DynamicStruct::Reader::get(&local_720,(Reader *)&stack0x00000008,(StringPtr)_auStack_730);
  RVar11 = DynamicValue::Reader::as<unsigned_long>(&local_720);
  DynamicValue::Reader::~Reader(&local_720);
  if (RVar11 != 0xab54a98ceb1f0ad2) {
    local_731 = kj::_::Debug::shouldLog(ERROR);
    while (local_731 != false) {
      local_740 = 0xab54a98ceb1f0ad2;
      kj::StringPtr::StringPtr((StringPtr *)&local_7a0,"uInt64Field");
      DynamicStruct::Reader::get(&local_790,(Reader *)&stack0x00000008,(StringPtr)local_7a0);
      local_748 = DynamicValue::Reader::as<unsigned_long>(&local_790);
      kj::_::Debug::log<char_const(&)[98],unsigned_long_long,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x15b,ERROR,
                 "\"failed: expected \" \"(12345678901234567890ull) == (reader.get(\\\"uInt64Field\\\").template as<uint64_t>())\", 12345678901234567890ull, reader.get(\"uInt64Field\").template as<uint64_t>()"
                 ,(char (*) [98])
                  "failed: expected (12345678901234567890ull) == (reader.get(\"uInt64Field\").template as<uint64_t>())"
                 ,&local_740,&local_748);
      DynamicValue::Reader::~Reader(&local_790);
      local_731 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_7f8,"float32Field");
  DynamicStruct::Reader::get(&local_7e8,(Reader *)&stack0x00000008,(StringPtr)_auStack_7f8);
  RVar12 = DynamicValue::Reader::as<float>(&local_7e8);
  bVar1 = kj::_::floatAlmostEqual(RVar12,1234.5);
  DynamicValue::Reader::~Reader(&local_7e8);
  if (!bVar1) {
    local_7f9 = kj::_::Debug::shouldLog(ERROR);
    while (local_7f9 != false) {
      kj::StringPtr::StringPtr((StringPtr *)&local_858,"float32Field");
      DynamicStruct::Reader::get(&local_848,(Reader *)&stack0x00000008,(StringPtr)local_858);
      local_800 = DynamicValue::Reader::as<float>(&local_848);
      local_85c = 1234.5;
      kj::_::Debug::log<char_const(&)[101],float,float>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x15c,ERROR,
                 "\"failed: expected \" \"::kj::_::floatAlmostEqual(reader.get(\\\"float32Field\\\").template as<float>(), 1234.5f)\", reader.get(\"float32Field\").template as<float>(), 1234.5f"
                 ,(char (*) [101])
                  "failed: expected ::kj::_::floatAlmostEqual(reader.get(\"float32Field\").template as<float>(), 1234.5f)"
                 ,&local_800,&local_85c);
      DynamicValue::Reader::~Reader(&local_848);
      local_7f9 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_8b8,"float64Field");
  DynamicStruct::Reader::get(&local_8a8,(Reader *)&stack0x00000008,(StringPtr)_auStack_8b8);
  RVar14 = DynamicValue::Reader::as<double>(&local_8a8);
  bVar1 = kj::_::doubleAlmostEqual(RVar14,-1.23e+47);
  DynamicValue::Reader::~Reader(&local_8a8);
  if (!bVar1) {
    local_8b9 = kj::_::Debug::shouldLog(ERROR);
    while (local_8b9 != false) {
      kj::StringPtr::StringPtr((StringPtr *)&local_920,"float64Field");
      DynamicStruct::Reader::get(&local_910,(Reader *)&stack0x00000008,(StringPtr)local_920);
      local_8c8 = DynamicValue::Reader::as<double>(&local_910);
      local_928 = -1.23e+47;
      kj::_::Debug::log<char_const(&)[103],double,double>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x15d,ERROR,
                 "\"failed: expected \" \"::kj::_::doubleAlmostEqual(reader.get(\\\"float64Field\\\").template as<double>(), -123e45)\", reader.get(\"float64Field\").template as<double>(), -123e45"
                 ,(char (*) [103])
                  "failed: expected ::kj::_::doubleAlmostEqual(reader.get(\"float64Field\").template as<double>(), -123e45)"
                 ,&local_8c8,&local_928);
      DynamicValue::Reader::~Reader(&local_910);
      local_8b9 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_990,"textField");
  DynamicStruct::Reader::get(&local_980,(Reader *)&stack0x00000008,(StringPtr)_auStack_990);
  local_938 = (ArrayPtr<const_char>)DynamicValue::Reader::as<capnp::Text>(&local_980);
  bVar1 = kj::operator==("foo",(StringPtr *)&local_938);
  DynamicValue::Reader::~Reader(&local_980);
  if (!bVar1) {
    local_991 = kj::_::Debug::shouldLog(ERROR);
    while (local_991 != false) {
      kj::StringPtr::StringPtr((StringPtr *)&local_a00,"textField");
      DynamicStruct::Reader::get(&local_9f0,(Reader *)&stack0x00000008,(StringPtr)local_a00);
      AVar15 = (ArrayPtr<const_char>)DynamicValue::Reader::as<capnp::Text>(&local_9f0);
      local_9a8 = AVar15;
      kj::_::Debug::log<char_const(&)[74],char_const(&)[4],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x15e,ERROR,
                 "\"failed: expected \" \"(\\\"foo\\\") == (reader.get(\\\"textField\\\").template as<Text>())\", \"foo\", reader.get(\"textField\").template as<Text>()"
                 ,(char (*) [74])
                  "failed: expected (\"foo\") == (reader.get(\"textField\").template as<Text>())",
                 (char (*) [4])"foo",(Reader *)&local_9a8);
      DynamicValue::Reader::~Reader(&local_9f0);
      local_991 = false;
    }
  }
  local_a10 = (ArrayPtr<const_unsigned_char>)_::data("bar");
  kj::StringPtr::StringPtr((StringPtr *)auStack_a78,"dataField");
  DynamicStruct::Reader::get(&local_a68,(Reader *)&stack0x00000008,(StringPtr)_auStack_a78);
  local_a20 = (ArrayPtr<const_unsigned_char>)DynamicValue::Reader::as<capnp::Data>(&local_a68);
  bVar1 = kj::ArrayPtr<const_unsigned_char>::operator==(&local_a10,&local_a20);
  DynamicValue::Reader::~Reader(&local_a68);
  if (!bVar1) {
    local_a79 = kj::_::Debug::shouldLog(ERROR);
    while (local_a79 != false) {
      local_a90 = (ArrayPtr<const_unsigned_char>)_::data("bar");
      kj::StringPtr::StringPtr((StringPtr *)&subReader.reader.nestingLimit,"dataField");
      DynamicStruct::Reader::get
                (&local_ae8,(Reader *)&stack0x00000008,(StringPtr)stack0xfffffffffffff508);
      AVar16 = (ArrayPtr<const_unsigned_char>)DynamicValue::Reader::as<capnp::Data>(&local_ae8);
      local_aa0 = AVar16;
      kj::_::Debug::log<char_const(&)[80],capnp::Data::Reader,capnp::Data::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x15f,ERROR,
                 "\"failed: expected \" \"(data(\\\"bar\\\")) == (reader.get(\\\"dataField\\\").template as<Data>())\", data(\"bar\"), reader.get(\"dataField\").template as<Data>()"
                 ,(char (*) [80])
                  "failed: expected (data(\"bar\")) == (reader.get(\"dataField\").template as<Data>())"
                 ,(Reader *)&local_a90,(Reader *)&local_aa0);
      DynamicValue::Reader::~Reader(&local_ae8);
      local_a79 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)&local_b88,"structField");
  DynamicStruct::Reader::get(&local_b78,(Reader *)&stack0x00000008,(StringPtr)local_b88);
  DynamicValue::Reader::as<capnp::DynamicStruct>
            ((ReaderFor<capnp::DynamicStruct> *)local_b30,&local_b78);
  DynamicValue::Reader::~Reader(&local_b78);
  kj::StringPtr::StringPtr((StringPtr *)auStack_be8,"voidField");
  DynamicStruct::Reader::get(&local_bd8,(Reader *)local_b30,(StringPtr)_auStack_be8);
  DynamicValue::Reader::as<capnp::Void>(&local_bd8);
  bVar1 = Void::operator==((Void *)&VOID);
  DynamicValue::Reader::~Reader(&local_bd8);
  if (!bVar1) {
    local_bea = kj::_::Debug::shouldLog(ERROR);
    while (local_bea != false) {
      kj::StringPtr::StringPtr((StringPtr *)&local_c48,"voidField");
      DynamicStruct::Reader::get(&local_c38,(Reader *)local_b30,(StringPtr)local_c48);
      DynamicValue::Reader::as<capnp::Void>(&local_c38);
      kj::_::Debug::log<char_const(&)[76],capnp::Void_const&,capnp::Void>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x162,ERROR,
                 "\"failed: expected \" \"(VOID) == (subReader.get(\\\"voidField\\\").template as<Void>())\", VOID, subReader.get(\"voidField\").template as<Void>()"
                 ,(char (*) [76])
                  "failed: expected (VOID) == (subReader.get(\"voidField\").template as<Void>())",
                 (Void *)&VOID,&local_beb);
      DynamicValue::Reader::~Reader(&local_c38);
      local_bea = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_ca8,"boolField");
  DynamicStruct::Reader::get(&local_c98,(Reader *)local_b30,(StringPtr)_auStack_ca8);
  RVar2 = DynamicValue::Reader::as<bool>(&local_c98);
  DynamicValue::Reader::~Reader(&local_c98);
  if (!RVar2) {
    local_ca9 = kj::_::Debug::shouldLog(ERROR);
    while (local_ca9 != false) {
      local_caa = true;
      kj::StringPtr::StringPtr((StringPtr *)&local_d08,"boolField");
      DynamicStruct::Reader::get(&local_cf8,(Reader *)local_b30,(StringPtr)local_d08);
      local_cab = DynamicValue::Reader::as<bool>(&local_cf8);
      kj::_::Debug::log<char_const(&)[76],bool,bool>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x163,ERROR,
                 "\"failed: expected \" \"(true) == (subReader.get(\\\"boolField\\\").template as<bool>())\", true, subReader.get(\"boolField\").template as<bool>()"
                 ,(char (*) [76])
                  "failed: expected (true) == (subReader.get(\"boolField\").template as<bool>())",
                 &local_caa,&local_cab);
      DynamicValue::Reader::~Reader(&local_cf8);
      local_ca9 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_d60,"int8Field");
  DynamicStruct::Reader::get(&local_d50,(Reader *)local_b30,(StringPtr)_auStack_d60);
  RVar3 = DynamicValue::Reader::as<signed_char>(&local_d50);
  DynamicValue::Reader::~Reader(&local_d50);
  if (RVar3 != -0xc) {
    local_d61 = kj::_::Debug::shouldLog(ERROR);
    while (local_d61 != false) {
      local_d68 = -0xc;
      kj::StringPtr::StringPtr((StringPtr *)&local_dc8,"int8Field");
      DynamicStruct::Reader::get(&local_db8,(Reader *)local_b30,(StringPtr)local_dc8);
      local_d69 = DynamicValue::Reader::as<signed_char>(&local_db8);
      kj::_::Debug::log<char_const(&)[77],int,signed_char>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x164,ERROR,
                 "\"failed: expected \" \"(-12) == (subReader.get(\\\"int8Field\\\").template as<int8_t>())\", -12, subReader.get(\"int8Field\").template as<int8_t>()"
                 ,(char (*) [77])
                  "failed: expected (-12) == (subReader.get(\"int8Field\").template as<int8_t>())",
                 &local_d68,&local_d69);
      DynamicValue::Reader::~Reader(&local_db8);
      local_d61 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_e20,"int16Field");
  DynamicStruct::Reader::get(&local_e10,(Reader *)local_b30,(StringPtr)_auStack_e20);
  RVar5 = DynamicValue::Reader::as<short>(&local_e10);
  DynamicValue::Reader::~Reader(&local_e10);
  if (RVar5 != 0xd80) {
    local_e21 = kj::_::Debug::shouldLog(ERROR);
    while (local_e21 != false) {
      local_e28 = 0xd80;
      kj::StringPtr::StringPtr((StringPtr *)&local_e88,"int16Field");
      DynamicStruct::Reader::get(&local_e78,(Reader *)local_b30,(StringPtr)local_e88);
      local_e2a = DynamicValue::Reader::as<short>(&local_e78);
      kj::_::Debug::log<char_const(&)[80],int,short>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x165,ERROR,
                 "\"failed: expected \" \"(3456) == (subReader.get(\\\"int16Field\\\").template as<int16_t>())\", 3456, subReader.get(\"int16Field\").template as<int16_t>()"
                 ,(char (*) [80])
                  "failed: expected (3456) == (subReader.get(\"int16Field\").template as<int16_t>())"
                 ,&local_e28,&local_e2a);
      DynamicValue::Reader::~Reader(&local_e78);
      local_e21 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_ee0,"int32Field");
  DynamicStruct::Reader::get(&local_ed0,(Reader *)local_b30,(StringPtr)_auStack_ee0);
  RVar7 = DynamicValue::Reader::as<int>(&local_ed0);
  DynamicValue::Reader::~Reader(&local_ed0);
  if (RVar7 != -0x4b3eff2) {
    local_ee1 = kj::_::Debug::shouldLog(ERROR);
    while (local_ee1 != false) {
      local_ee8 = -0x4b3eff2;
      kj::StringPtr::StringPtr((StringPtr *)&local_f48,"int32Field");
      DynamicStruct::Reader::get(&local_f38,(Reader *)local_b30,(StringPtr)local_f48);
      local_eec = DynamicValue::Reader::as<int>(&local_f38);
      kj::_::Debug::log<char_const(&)[85],int,int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x166,ERROR,
                 "\"failed: expected \" \"(-78901234) == (subReader.get(\\\"int32Field\\\").template as<int32_t>())\", -78901234, subReader.get(\"int32Field\").template as<int32_t>()"
                 ,(char (*) [85])
                  "failed: expected (-78901234) == (subReader.get(\"int32Field\").template as<int32_t>())"
                 ,&local_ee8,&local_eec);
      DynamicValue::Reader::~Reader(&local_f38);
      local_ee1 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_fa0,"int64Field");
  DynamicStruct::Reader::get(&local_f90,(Reader *)local_b30,(StringPtr)_auStack_fa0);
  RVar10 = DynamicValue::Reader::as<long>(&local_f90);
  DynamicValue::Reader::~Reader(&local_f90);
  if (RVar10 != 0x33a638e8734e) {
    local_fa1 = kj::_::Debug::shouldLog(ERROR);
    while (local_fa1 != false) {
      local_fb0 = 0x33a638e8734e;
      kj::StringPtr::StringPtr((StringPtr *)&local_1010,"int64Field");
      DynamicStruct::Reader::get(&local_1000,(Reader *)local_b30,(StringPtr)local_1010);
      local_fb8 = DynamicValue::Reader::as<long>(&local_1000);
      kj::_::Debug::log<char_const(&)[92],long_long,long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x167,ERROR,
                 "\"failed: expected \" \"(56789012345678ll) == (subReader.get(\\\"int64Field\\\").template as<int64_t>())\", 56789012345678ll, subReader.get(\"int64Field\").template as<int64_t>()"
                 ,(char (*) [92])
                  "failed: expected (56789012345678ll) == (subReader.get(\"int64Field\").template as<int64_t>())"
                 ,&local_fb0,&local_fb8);
      DynamicValue::Reader::~Reader(&local_1000);
      local_fa1 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_1068,"uInt8Field");
  DynamicStruct::Reader::get(&local_1058,(Reader *)local_b30,(StringPtr)_auStack_1068);
  RVar4 = DynamicValue::Reader::as<unsigned_char>(&local_1058);
  DynamicValue::Reader::~Reader(&local_1058);
  if (RVar4 != 'Z') {
    local_1069 = kj::_::Debug::shouldLog(ERROR);
    while (local_1069 != false) {
      local_1070 = 0x5a;
      kj::StringPtr::StringPtr((StringPtr *)&local_10d0,"uInt8Field");
      DynamicStruct::Reader::get(&local_10c0,(Reader *)local_b30,(StringPtr)local_10d0);
      local_1071 = DynamicValue::Reader::as<unsigned_char>(&local_10c0);
      kj::_::Debug::log<char_const(&)[79],unsigned_int,unsigned_char>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x168,ERROR,
                 "\"failed: expected \" \"(90u) == (subReader.get(\\\"uInt8Field\\\").template as<uint8_t>())\", 90u, subReader.get(\"uInt8Field\").template as<uint8_t>()"
                 ,(char (*) [79])
                  "failed: expected (90u) == (subReader.get(\"uInt8Field\").template as<uint8_t>())"
                 ,&local_1070,&local_1071);
      DynamicValue::Reader::~Reader(&local_10c0);
      local_1069 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_1128,"uInt16Field");
  DynamicStruct::Reader::get(&local_1118,(Reader *)local_b30,(StringPtr)_auStack_1128);
  RVar6 = DynamicValue::Reader::as<unsigned_short>(&local_1118);
  DynamicValue::Reader::~Reader(&local_1118);
  if (RVar6 != 0x4d2) {
    local_1129 = kj::_::Debug::shouldLog(ERROR);
    while (local_1129 != false) {
      local_1130 = 0x4d2;
      kj::StringPtr::StringPtr((StringPtr *)&local_1190,"uInt16Field");
      DynamicStruct::Reader::get(&local_1180,(Reader *)local_b30,(StringPtr)local_1190);
      local_1132 = DynamicValue::Reader::as<unsigned_short>(&local_1180);
      kj::_::Debug::log<char_const(&)[83],unsigned_int,unsigned_short>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x169,ERROR,
                 "\"failed: expected \" \"(1234u) == (subReader.get(\\\"uInt16Field\\\").template as<uint16_t>())\", 1234u, subReader.get(\"uInt16Field\").template as<uint16_t>()"
                 ,(char (*) [83])
                  "failed: expected (1234u) == (subReader.get(\"uInt16Field\").template as<uint16_t>())"
                 ,&local_1130,&local_1132);
      DynamicValue::Reader::~Reader(&local_1180);
      local_1129 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_11e8,"uInt32Field");
  DynamicStruct::Reader::get(&local_11d8,(Reader *)local_b30,(StringPtr)_auStack_11e8);
  RVar8 = DynamicValue::Reader::as<unsigned_int>(&local_11d8);
  DynamicValue::Reader::~Reader(&local_11d8);
  if (RVar8 != 0x3628814) {
    local_11e9 = kj::_::Debug::shouldLog(ERROR);
    while (local_11e9 != false) {
      local_11f0 = 0x3628814;
      kj::StringPtr::StringPtr((StringPtr *)&local_1250,"uInt32Field");
      DynamicStruct::Reader::get(&local_1240,(Reader *)local_b30,(StringPtr)local_1250);
      local_11f4 = DynamicValue::Reader::as<unsigned_int>(&local_1240);
      kj::_::Debug::log<char_const(&)[87],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x16a,ERROR,
                 "\"failed: expected \" \"(56789012u) == (subReader.get(\\\"uInt32Field\\\").template as<uint32_t>())\", 56789012u, subReader.get(\"uInt32Field\").template as<uint32_t>()"
                 ,(char (*) [87])
                  "failed: expected (56789012u) == (subReader.get(\"uInt32Field\").template as<uint32_t>())"
                 ,&local_11f0,&local_11f4);
      DynamicValue::Reader::~Reader(&local_1240);
      local_11e9 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_12a8,"uInt64Field");
  DynamicStruct::Reader::get(&local_1298,(Reader *)local_b30,(StringPtr)_auStack_12a8);
  RVar11 = DynamicValue::Reader::as<unsigned_long>(&local_1298);
  DynamicValue::Reader::~Reader(&local_1298);
  if (RVar11 != 0x4cc1921126f0ad2) {
    local_12a9 = kj::_::Debug::shouldLog(ERROR);
    while (local_12a9 != false) {
      local_12b8 = 0x4cc1921126f0ad2;
      kj::StringPtr::StringPtr((StringPtr *)&local_1318,"uInt64Field");
      DynamicStruct::Reader::get(&local_1308,(Reader *)local_b30,(StringPtr)local_1318);
      local_12c0 = DynamicValue::Reader::as<unsigned_long>(&local_1308);
      kj::_::Debug::log<char_const(&)[99],unsigned_long_long,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x16b,ERROR,
                 "\"failed: expected \" \"(345678901234567890ull) == (subReader.get(\\\"uInt64Field\\\").template as<uint64_t>())\", 345678901234567890ull, subReader.get(\"uInt64Field\").template as<uint64_t>()"
                 ,(char (*) [99])
                  "failed: expected (345678901234567890ull) == (subReader.get(\"uInt64Field\").template as<uint64_t>())"
                 ,&local_12b8,&local_12c0);
      DynamicValue::Reader::~Reader(&local_1308);
      local_12a9 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_1370,"float32Field");
  DynamicStruct::Reader::get(&local_1360,(Reader *)local_b30,(StringPtr)_auStack_1370);
  RVar12 = DynamicValue::Reader::as<float>(&local_1360);
  bVar1 = kj::_::floatAlmostEqual(RVar12,-1.25e-10);
  DynamicValue::Reader::~Reader(&local_1360);
  if (!bVar1) {
    local_1371 = kj::_::Debug::shouldLog(ERROR);
    while (local_1371 != false) {
      kj::StringPtr::StringPtr((StringPtr *)&local_13d0,"float32Field");
      DynamicStruct::Reader::get(&local_13c0,(Reader *)local_b30,(StringPtr)local_13d0);
      local_1378 = DynamicValue::Reader::as<float>(&local_13c0);
      local_13d4 = -1.25e-10;
      kj::_::Debug::log<char_const(&)[107],float,float>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x16c,ERROR,
                 "\"failed: expected \" \"::kj::_::floatAlmostEqual(subReader.get(\\\"float32Field\\\").template as<float>(), -1.25e-10f)\", subReader.get(\"float32Field\").template as<float>(), -1.25e-10f"
                 ,(char (*) [107])
                  "failed: expected ::kj::_::floatAlmostEqual(subReader.get(\"float32Field\").template as<float>(), -1.25e-10f)"
                 ,&local_1378,&local_13d4);
      DynamicValue::Reader::~Reader(&local_13c0);
      local_1371 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_1430,"float64Field");
  DynamicStruct::Reader::get(&local_1420,(Reader *)local_b30,(StringPtr)_auStack_1430);
  RVar14 = DynamicValue::Reader::as<double>(&local_1420);
  bVar1 = kj::_::doubleAlmostEqual(RVar14,345.0);
  DynamicValue::Reader::~Reader(&local_1420);
  if (!bVar1) {
    local_1431 = kj::_::Debug::shouldLog(ERROR);
    while (local_1431 != false) {
      kj::StringPtr::StringPtr((StringPtr *)&local_1498,"float64Field");
      DynamicStruct::Reader::get(&local_1488,(Reader *)local_b30,(StringPtr)local_1498);
      local_1440 = DynamicValue::Reader::as<double>(&local_1488);
      local_149c = 0x159;
      kj::_::Debug::log<char_const(&)[102],double,int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x16d,ERROR,
                 "\"failed: expected \" \"::kj::_::doubleAlmostEqual(subReader.get(\\\"float64Field\\\").template as<double>(), 345)\", subReader.get(\"float64Field\").template as<double>(), 345"
                 ,(char (*) [102])
                  "failed: expected ::kj::_::doubleAlmostEqual(subReader.get(\"float64Field\").template as<double>(), 345)"
                 ,&local_1440,&local_149c);
      DynamicValue::Reader::~Reader(&local_1488);
      local_1431 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_1508,"textField");
  DynamicStruct::Reader::get(&local_14f8,(Reader *)local_b30,(StringPtr)_auStack_1508);
  local_14b0 = (ArrayPtr<const_char>)DynamicValue::Reader::as<capnp::Text>(&local_14f8);
  bVar1 = kj::operator==("baz",(StringPtr *)&local_14b0);
  DynamicValue::Reader::~Reader(&local_14f8);
  if (!bVar1) {
    local_1509 = kj::_::Debug::shouldLog(ERROR);
    while (local_1509 != false) {
      kj::StringPtr::StringPtr((StringPtr *)&local_1578,"textField");
      DynamicStruct::Reader::get(&local_1568,(Reader *)local_b30,(StringPtr)local_1578);
      AVar15 = (ArrayPtr<const_char>)DynamicValue::Reader::as<capnp::Text>(&local_1568);
      local_1520 = AVar15;
      kj::_::Debug::log<char_const(&)[77],char_const(&)[4],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x16e,ERROR,
                 "\"failed: expected \" \"(\\\"baz\\\") == (subReader.get(\\\"textField\\\").template as<Text>())\", \"baz\", subReader.get(\"textField\").template as<Text>()"
                 ,(char (*) [77])
                  "failed: expected (\"baz\") == (subReader.get(\"textField\").template as<Text>())"
                 ,(char (*) [4])0x4bdece,(Reader *)&local_1520);
      DynamicValue::Reader::~Reader(&local_1568);
      local_1509 = false;
    }
  }
  local_1588 = (ArrayPtr<const_unsigned_char>)_::data("qux");
  kj::StringPtr::StringPtr((StringPtr *)auStack_15f0,"dataField");
  DynamicStruct::Reader::get(&local_15e0,(Reader *)local_b30,(StringPtr)_auStack_15f0);
  local_1598 = (ArrayPtr<const_unsigned_char>)DynamicValue::Reader::as<capnp::Data>(&local_15e0);
  bVar1 = kj::ArrayPtr<const_unsigned_char>::operator==(&local_1588,&local_1598);
  DynamicValue::Reader::~Reader(&local_15e0);
  if (!bVar1) {
    local_15f1 = kj::_::Debug::shouldLog(ERROR);
    while (local_15f1 != false) {
      local_1608 = (ArrayPtr<const_unsigned_char>)_::data("qux");
      kj::StringPtr::StringPtr((StringPtr *)&subSubReader.reader.nestingLimit,"dataField");
      DynamicStruct::Reader::get(&local_1660,(Reader *)local_b30,(StringPtr)stack0xffffffffffffe990)
      ;
      AVar16 = (ArrayPtr<const_unsigned_char>)DynamicValue::Reader::as<capnp::Data>(&local_1660);
      local_1618 = AVar16;
      kj::_::Debug::log<char_const(&)[83],capnp::Data::Reader,capnp::Data::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x16f,ERROR,
                 "\"failed: expected \" \"(data(\\\"qux\\\")) == (subReader.get(\\\"dataField\\\").template as<Data>())\", data(\"qux\"), subReader.get(\"dataField\").template as<Data>()"
                 ,(char (*) [83])
                  "failed: expected (data(\"qux\")) == (subReader.get(\"dataField\").template as<Data>())"
                 ,(Reader *)&local_1608,(Reader *)&local_1618);
      DynamicValue::Reader::~Reader(&local_1660);
      local_15f1 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)&local_1700,"structField");
  DynamicStruct::Reader::get(&local_16f0,(Reader *)local_b30,(StringPtr)local_1700);
  DynamicValue::Reader::as<capnp::DynamicStruct>
            ((ReaderFor<capnp::DynamicStruct> *)local_16a8,&local_16f0);
  DynamicValue::Reader::~Reader(&local_16f0);
  kj::StringPtr::StringPtr((StringPtr *)auStack_1768,"textField");
  DynamicStruct::Reader::get(&local_1758,(Reader *)local_16a8,(StringPtr)_auStack_1768);
  local_1710 = (ArrayPtr<const_char>)DynamicValue::Reader::as<capnp::Text>(&local_1758);
  bVar1 = kj::operator==("nested",(StringPtr *)&local_1710);
  DynamicValue::Reader::~Reader(&local_1758);
  if (!bVar1) {
    local_1769 = kj::_::Debug::shouldLog(ERROR);
    while (local_1769 != false) {
      kj::StringPtr::StringPtr((StringPtr *)&local_17d8,"textField");
      DynamicStruct::Reader::get(&local_17c8,(Reader *)local_16a8,(StringPtr)local_17d8);
      AVar15 = (ArrayPtr<const_char>)DynamicValue::Reader::as<capnp::Text>(&local_17c8);
      local_1780 = AVar15;
      kj::_::Debug::log<char_const(&)[83],char_const(&)[7],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x172,ERROR,
                 "\"failed: expected \" \"(\\\"nested\\\") == (subSubReader.get(\\\"textField\\\").template as<Text>())\", \"nested\", subSubReader.get(\"textField\").template as<Text>()"
                 ,(char (*) [83])
                  "failed: expected (\"nested\") == (subSubReader.get(\"textField\").template as<Text>())"
                 ,(char (*) [7])0x4cc19c,(Reader *)&local_1780);
      DynamicValue::Reader::~Reader(&local_17c8);
      local_1769 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)&local_18c0,"structField");
  DynamicStruct::Reader::get(&local_18b0,(Reader *)local_16a8,(StringPtr)local_18c0);
  DynamicValue::Reader::as<capnp::DynamicStruct>(&local_1868,&local_18b0);
  kj::StringPtr::StringPtr((StringPtr *)auStack_18d0,"textField");
  DynamicStruct::Reader::get(&local_1830,&local_1868,(StringPtr)_auStack_18d0);
  local_17e8 = (ArrayPtr<const_char>)DynamicValue::Reader::as<capnp::Text>(&local_1830);
  bVar1 = kj::operator==("really nested",(StringPtr *)&local_17e8);
  DynamicValue::Reader::~Reader(&local_1830);
  DynamicValue::Reader::~Reader(&local_18b0);
  if (!bVar1) {
    local_18d1 = kj::_::Debug::shouldLog(ERROR);
    while (local_18d1 != false) {
      kj::StringPtr::StringPtr((StringPtr *)&local_19c0,"structField");
      DynamicStruct::Reader::get(&local_19b0,(Reader *)local_16a8,(StringPtr)local_19c0);
      DynamicValue::Reader::as<capnp::DynamicStruct>(&local_1968,&local_19b0);
      kj::StringPtr::StringPtr((StringPtr *)&local_19d0,"textField");
      DynamicStruct::Reader::get(&local_1930,&local_1968,(StringPtr)local_19d0);
      AVar15 = (ArrayPtr<const_char>)DynamicValue::Reader::as<capnp::Text>(&local_1930);
      local_18e8 = AVar15;
      kj::_::Debug::log<char_const(&)[139],char_const(&)[14],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x174,ERROR,
                 "\"failed: expected \" \"(\\\"really nested\\\") == (subSubReader.get(\\\"structField\\\").template as<DynamicStruct>() .get(\\\"textField\\\").template as<Text>())\", \"really nested\", subSubReader.get(\"structField\").template as<DynamicStruct>() .get(\"textField\").template as<Text>()"
                 ,(char (*) [139])
                  "failed: expected (\"really nested\") == (subSubReader.get(\"structField\").template as<DynamicStruct>() .get(\"textField\").template as<Text>())"
                 ,(char (*) [14])"really nested",(Reader *)&local_18e8);
      DynamicValue::Reader::~Reader(&local_1930);
      DynamicValue::Reader::~Reader(&local_19b0);
      local_18d1 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)&local_1a48,"enumField");
  DynamicStruct::Reader::get(&local_1a38,(Reader *)local_b30,(StringPtr)local_1a48);
  RVar17 = DynamicValue::Reader::as<capnp::DynamicEnum>(&local_1a38);
  e._8_8_ = RVar17._8_8_;
  SStack_1a58.raw = (RawBrandedSchema *)RVar17.schema.super_Schema.raw;
  local_1a50 = RVar17.value;
  local_19e8 = CONCAT22(local_19e8._2_2_,local_1a50);
  e.schema.super_Schema.raw._4_4_ = 0;
  e.schema.super_Schema.raw._0_4_ = local_19e8;
  local_19f0.raw = SStack_1a58.raw;
  local_19e0 = (ArrayPtr<const_char>)anon_unknown_130::name((anon_unknown_130 *)SStack_1a58.raw,e);
  bVar1 = kj::operator==("baz",(StringPtr *)&local_19e0);
  DynamicValue::Reader::~Reader(&local_1a38);
  if (!bVar1) {
    local_1a59 = kj::_::Debug::shouldLog(ERROR);
    while (local_1a59 != false) {
      kj::StringPtr::StringPtr((StringPtr *)&local_1ad8,"enumField");
      DynamicStruct::Reader::get(&local_1ac8,(Reader *)local_b30,(StringPtr)local_1ad8);
      RVar17 = DynamicValue::Reader::as<capnp::DynamicEnum>(&local_1ac8);
      e_00._8_8_ = RVar17._8_8_;
      local_1ae8.raw = (RawBrandedSchema *)RVar17.schema.super_Schema.raw;
      local_1ae0 = RVar17.value;
      local_1a78 = CONCAT22(local_1a78._2_2_,local_1ae0);
      e_00.schema.super_Schema.raw._4_4_ = 0;
      e_00.schema.super_Schema.raw._0_4_ = local_1a78;
      local_1a80.raw = local_1ae8.raw;
      AVar15 = (ArrayPtr<const_char>)anon_unknown_130::name((anon_unknown_130 *)local_1ae8.raw,e_00)
      ;
      local_1a70 = AVar15;
      kj::_::Debug::log<char_const(&)[90],char_const(&)[4],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x176,ERROR,
                 "\"failed: expected \" \"(\\\"baz\\\") == (name(subReader.get(\\\"enumField\\\").template as<DynamicEnum>()))\", \"baz\", name(subReader.get(\"enumField\").template as<DynamicEnum>())"
                 ,(char (*) [90])
                  "failed: expected (\"baz\") == (name(subReader.get(\"enumField\").template as<DynamicEnum>()))"
                 ,(char (*) [4])0x4bdece,(Reader *)&local_1a70);
      DynamicValue::Reader::~Reader(&local_1ac8);
      local_1a59 = false;
    }
  }
  kj::StringPtr::StringPtr(&local_1b40,"voidList");
  name_23.content.size_ = local_1b40.content.size_;
  name_23.content.ptr = local_1b40.content.ptr;
  DynamicStruct::Reader::get(&local_1b30,(Reader *)local_b30,name_23);
  local_1b53._3_8_ = local_1b53;
  local_1b53._11_8_ = 3;
  expected._M_len = local_1b40.content.size_;
  expected._M_array = (iterator)0x3;
  checkList<capnp::Void,capnp::DynamicValue::Reader>
            ((_ *)&local_1b30,(Reader *)local_1b53._3_8_,expected);
  DynamicValue::Reader::~Reader(&local_1b30);
  kj::StringPtr::StringPtr(&local_1bb0,"boolList");
  name_22.content.size_ = local_1bb0.content.size_;
  name_22.content.ptr = local_1bb0.content.ptr;
  DynamicStruct::Reader::get(&local_1ba0,(Reader *)local_b30,name_22);
  local_1bc5[0] = UNKNOWN;
  local_1bc5[1] = 1;
  local_1bc5[2] = UNKNOWN >> 0x10;
  local_1bc5[3] = 1;
  local_1bc5[4] = 1;
  local_1bc5._5_8_ = local_1bc5;
  local_1bc5._13_8_ = 5;
  expected_00._M_len = local_1bb0.content.size_;
  expected_00._M_array = (iterator)0x5;
  checkList<bool,capnp::DynamicValue::Reader>
            ((_ *)&local_1ba0,(Reader *)local_1bc5._5_8_,expected_00);
  DynamicValue::Reader::~Reader(&local_1ba0);
  kj::StringPtr::StringPtr(&local_1c20,"int8List");
  name_21.content.size_ = local_1c20.content.size_;
  name_21.content.ptr = local_1c20.content.ptr;
  DynamicStruct::Reader::get(&local_1c10,(Reader *)local_b30,name_21);
  local_1c34[0] = ANY_POINTER;
  local_1c34[1] = 0xde;
  local_1c34[2] = 0x80;
  local_1c34[3] = 0x7f;
  local_1c34._4_8_ = local_1c34;
  local_1c34._12_8_ = 4;
  expected_01._M_len = local_1c20.content.size_;
  expected_01._M_array = (iterator)0x4;
  checkList<signed_char,capnp::DynamicValue::Reader>
            ((_ *)&local_1c10,(Reader *)local_1c34._4_8_,expected_01);
  DynamicValue::Reader::~Reader(&local_1c10);
  kj::StringPtr::StringPtr((StringPtr *)(local_1ca8 + 0x18),"int16List");
  name_20.content.size_ = local_1ca8._32_8_;
  name_20.content.ptr = (char *)local_1ca8._24_8_;
  DynamicStruct::Reader::get(&local_1c80,(Reader *)local_b30,name_20);
  local_1ca8._0_2_ = 0x4d2;
  local_1ca8._2_2_ = 0xe9d2;
  local_1ca8._4_2_ = 0x8000;
  local_1ca8._6_2_ = 0x7fff;
  local_1ca8._8_8_ = local_1ca8;
  local_1ca8._16_8_ = 4;
  expected_02._M_len = local_1ca8._32_8_;
  expected_02._M_array = (iterator)0x4;
  checkList<short,capnp::DynamicValue::Reader>
            ((_ *)&local_1c80,(Reader *)local_1ca8._8_8_,expected_02);
  DynamicValue::Reader::~Reader(&local_1c80);
  kj::StringPtr::StringPtr((StringPtr *)(local_1d20 + 0x20),"int32List");
  name_19.content.size_ = local_1d20._40_8_;
  name_19.content.ptr = (char *)local_1d20._32_8_;
  DynamicStruct::Reader::get(&local_1cf0,(Reader *)local_b30,name_19);
  local_1d20._0_4_ = 0xbc614e;
  local_1d20._4_4_ = 0xfaa0d340;
  local_1d20._8_4_ = 0x80000000;
  local_1d20._12_4_ = 0x7fffffff;
  local_1d20._16_8_ = local_1d20;
  local_1d20._24_8_ = (SegmentReader *)0x4;
  expected_03._M_len = local_1d20._40_8_;
  expected_03._M_array = (iterator)0x4;
  checkList<int,capnp::DynamicValue::Reader>
            ((_ *)&local_1cf0,(Reader *)local_1d20._16_8_,expected_03);
  DynamicValue::Reader::~Reader(&local_1cf0);
  kj::StringPtr::StringPtr((StringPtr *)(local_1da8 + 0x30),"int64List");
  name_18.content.size_ = local_1da8._56_8_;
  name_18.content.ptr = (char *)local_1da8._48_8_;
  DynamicStruct::Reader::get(&local_1d68,(Reader *)local_b30,name_18);
  local_1da8._16_8_ = 0x8000000000000000;
  local_1da8._24_8_ = (SegmentReader *)0x7fffffffffffffff;
  local_1da8._0_8_ = 0x7048860ddf79;
  local_1da8._8_8_ = (char *)0xfffd968afd13752e;
  local_1da8._32_8_ = local_1da8;
  local_1da8._40_8_ = (byte *)0x4;
  expected_04._M_len = local_1da8._56_8_;
  expected_04._M_array = (iterator)0x4;
  checkList<long,capnp::DynamicValue::Reader>
            ((_ *)&local_1d68,(Reader *)local_1da8._32_8_,expected_04);
  DynamicValue::Reader::~Reader(&local_1d68);
  kj::StringPtr::StringPtr(&local_1e00,"uInt8List");
  name_17.content.size_ = local_1e00.content.size_;
  name_17.content.ptr = local_1e00.content.ptr;
  DynamicStruct::Reader::get(&local_1df0,(Reader *)local_b30,name_17);
  local_1e14[0] = ANY_POINTER;
  local_1e14[1] = 0x22;
  local_1e14[2] = UNKNOWN >> 0x10;
  local_1e14[3] = 0xff;
  local_1e14._4_8_ = local_1e14;
  local_1e14._12_8_ = 4;
  expected_05._M_len = local_1e00.content.size_;
  expected_05._M_array = (iterator)0x4;
  checkList<unsigned_char,capnp::DynamicValue::Reader>
            ((_ *)&local_1df0,(Reader *)local_1e14._4_8_,expected_05);
  DynamicValue::Reader::~Reader(&local_1df0);
  kj::StringPtr::StringPtr((StringPtr *)(local_1e88 + 0x18),"uInt16List");
  name_16.content.size_ = local_1e88._32_8_;
  name_16.content.ptr = (char *)local_1e88._24_8_;
  DynamicStruct::Reader::get(&local_1e60,(Reader *)local_b30,name_16);
  local_1e88._0_2_ = 0x4d2;
  local_1e88._2_2_ = 0x162e;
  local_1e88._4_2_ = 0;
  local_1e88._6_2_ = 0xffff;
  local_1e88._8_8_ = local_1e88;
  local_1e88._16_8_ = 4;
  expected_06._M_len = local_1e88._32_8_;
  expected_06._M_array = (iterator)0x4;
  checkList<unsigned_short,capnp::DynamicValue::Reader>
            ((_ *)&local_1e60,(Reader *)local_1e88._8_8_,expected_06);
  DynamicValue::Reader::~Reader(&local_1e60);
  kj::StringPtr::StringPtr((StringPtr *)(local_1f00 + 0x20),"uInt32List");
  name_15.content.size_ = local_1f00._40_8_;
  name_15.content.ptr = (char *)local_1f00._32_8_;
  DynamicStruct::Reader::get(&local_1ed0,(Reader *)local_b30,name_15);
  local_1f00._0_4_ = 0xbc614e;
  local_1f00._4_4_ = 0x55f2cc0;
  local_1f00._8_4_ = 0;
  local_1f00._12_4_ = 0xffffffff;
  local_1f00._16_8_ = local_1f00;
  local_1f00._24_8_ = (SegmentReader *)0x4;
  expected_07._M_len = local_1f00._40_8_;
  expected_07._M_array = (iterator)0x4;
  checkList<unsigned_int,capnp::DynamicValue::Reader>
            ((_ *)&local_1ed0,(Reader *)local_1f00._16_8_,expected_07);
  DynamicValue::Reader::~Reader(&local_1ed0);
  kj::StringPtr::StringPtr((StringPtr *)(local_1f88 + 0x30),"uInt64List");
  name_14.content.size_ = local_1f88._56_8_;
  name_14.content.ptr = (char *)local_1f88._48_8_;
  DynamicStruct::Reader::get(&local_1f48,(Reader *)local_b30,name_14);
  local_1f88._16_8_ = 0;
  local_1f88._24_8_ = (SegmentReader *)0xffffffffffffffff;
  local_1f88._0_8_ = 0x7048860ddf79;
  local_1f88._8_8_ = 3.35421776919204e-309;
  local_1f88._32_8_ = local_1f88;
  local_1f88._40_8_ = (byte *)0x4;
  expected_08._M_len = local_1f88._56_8_;
  expected_08._M_array = (iterator)0x4;
  checkList<unsigned_long,capnp::DynamicValue::Reader>
            ((_ *)&local_1f48,(Reader *)local_1f88._32_8_,expected_08);
  DynamicValue::Reader::~Reader(&local_1f48);
  kj::StringPtr::StringPtr((StringPtr *)(local_2008 + 0x28),"float32List");
  name_13.content.size_ = local_2008._48_8_;
  name_13.content.ptr = (char *)local_2008._40_8_;
  DynamicStruct::Reader::get(&local_1fd0,(Reader *)local_b30,name_13);
  local_2008._16_8_ = (SegmentReader *)0x82081cea02081cea;
  local_2008._0_8_ = 0x4996b43800000000;
  local_2008._8_8_ = (char *)0xfcf0bdc27cf0bdc2;
  local_2008._24_8_ = local_2008;
  local_2008._32_8_ = (CapTableReader *)0x6;
  expected_09._M_len = local_2008._48_8_;
  expected_09._M_array = (iterator)0x6;
  checkList<float,capnp::DynamicValue::Reader>
            ((_ *)&local_1fd0,(Reader *)local_2008._24_8_,expected_09);
  DynamicValue::Reader::~Reader(&local_1fd0);
  kj::StringPtr::StringPtr(&local_2060,"float64List");
  name_12.content.size_ = local_2060.content.size_;
  name_12.content.ptr = local_2060.content.ptr;
  DynamicStruct::Reader::get(&local_2050,(Reader *)local_b30,name_12);
  local_20a8.field_1.listValue.reader.capTable = (CapTableReader *)0x66789e3750f791;
  local_20a8.field_1.listValue.reader.ptr = (byte *)0x8066789e3750f791;
  local_20a8.field_1.structValue.reader.segment = (SegmentReader *)0x7f76c8e5ca239029;
  local_20a8.field_1.listValue.reader.segment = (SegmentReader *)0xff76c8e5ca239029;
  local_20a8.type = UNKNOWN;
  local_20a8._4_4_ = 0;
  local_20a8.field_1.textValue.super_StringPtr.content.ptr = (char *)0x42dc12218377de40;
  local_20a8.field_1._48_8_ = &local_20a8;
  local_20a8.field_1._56_8_ = 6;
  expected_10._M_len = local_2060.content.size_;
  expected_10._M_array = (iterator)0x6;
  checkList<double,capnp::DynamicValue::Reader>
            ((_ *)&local_2050,(Reader *)local_20a8.field_1._48_8_,expected_10);
  DynamicValue::Reader::~Reader(&local_2050);
  kj::StringPtr::StringPtr(&local_2100,"textList");
  name_11.content.size_ = local_2100.content.size_;
  name_11.content.ptr = local_2100.content.ptr;
  DynamicStruct::Reader::get(&local_20f0,(Reader *)local_b30,name_11);
  Text::Reader::Reader((Reader *)local_2140,"quux");
  Text::Reader::Reader((Reader *)(local_2140 + 0x10),"corge");
  Text::Reader::Reader(local_2120,"grault");
  local_2120[1].super_StringPtr.content.ptr = local_2140;
  local_2120[1].super_StringPtr.content.size_ = 3;
  expected_11._M_len = local_2100.content.size_;
  expected_11._M_array = (iterator)0x3;
  checkList<capnp::Text,capnp::DynamicValue::Reader>
            ((_ *)&local_20f0,(Reader *)local_2120[1].super_StringPtr.content.ptr,expected_11);
  DynamicValue::Reader::~Reader(&local_20f0);
  kj::StringPtr::StringPtr((StringPtr *)&local_2198,"dataList");
  DynamicStruct::Reader::get(&local_2188,(Reader *)local_b30,(StringPtr)local_2198);
  RVar18 = _::data("garply");
  listReader.reader._40_8_ = RVar18.super_ArrayPtr<const_unsigned_char>.ptr;
  _::data("waldo");
  RVar18 = _::data("fred");
  expected_12._M_len = RVar18.super_ArrayPtr<const_unsigned_char>.size_;
  expected_12._M_array = (iterator)0x3;
  checkList<capnp::Data,capnp::DynamicValue::Reader>
            ((_ *)&local_2188,(Reader *)&listReader.reader.nestingLimit,expected_12);
  DynamicValue::Reader::~Reader(&local_2188);
  kj::StringPtr::StringPtr((StringPtr *)&f,"structList");
  DynamicStruct::Reader::get(&local_2260,(Reader *)local_b30,(StringPtr)_f);
  DynamicValue::Reader::as<capnp::DynamicList>
            ((ReaderFor<capnp::DynamicList> *)local_2218,&local_2260);
  DynamicValue::Reader::~Reader(&local_2260);
  uVar9 = DynamicList::Reader::size((Reader *)local_2218);
  if (uVar9 != 3) {
    local_227c = 3;
    local_2280 = DynamicList::Reader::size((Reader *)local_2218);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              (&local_2278,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x189,FAILED,"(3u) == (listReader.size())","3u, listReader.size()",&local_227c,
               &local_2280);
    kj::_::Debug::Fault::fatal(&local_2278);
  }
  DynamicList::Reader::operator[](&local_2358,(Reader *)local_2218,0);
  DynamicValue::Reader::as<capnp::DynamicStruct>(&local_2310,&local_2358);
  kj::StringPtr::StringPtr((StringPtr *)auStack_2368,"textField");
  DynamicStruct::Reader::get(&local_22d8,&local_2310,(StringPtr)_auStack_2368);
  local_2290 = (ArrayPtr<const_char>)DynamicValue::Reader::as<capnp::Text>(&local_22d8);
  bVar1 = kj::operator==("x structlist 1",(StringPtr *)&local_2290);
  DynamicValue::Reader::~Reader(&local_22d8);
  DynamicValue::Reader::~Reader(&local_2358);
  if (!bVar1) {
    local_2369 = kj::_::Debug::shouldLog(ERROR);
    while (local_2369 != false) {
      DynamicList::Reader::operator[](&local_2448,(Reader *)local_2218,0);
      DynamicValue::Reader::as<capnp::DynamicStruct>(&local_2400,&local_2448);
      kj::StringPtr::StringPtr((StringPtr *)&local_2458,"textField");
      DynamicStruct::Reader::get(&local_23c8,&local_2400,(StringPtr)local_2458);
      AVar15 = (ArrayPtr<const_char>)DynamicValue::Reader::as<capnp::Text>(&local_23c8);
      local_2380 = AVar15;
      kj::_::Debug::log<char_const(&)[121],char_const(&)[15],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x18a,ERROR,
                 "\"failed: expected \" \"(\\\"x structlist 1\\\") == (listReader[0].template as<DynamicStruct>().get(\\\"textField\\\").template as<Text>())\", \"x structlist 1\", listReader[0].template as<DynamicStruct>().get(\"textField\").template as<Text>()"
                 ,(char (*) [121])
                  "failed: expected (\"x structlist 1\") == (listReader[0].template as<DynamicStruct>().get(\"textField\").template as<Text>())"
                 ,(char (*) [15])"x structlist 1",(Reader *)&local_2380);
      DynamicValue::Reader::~Reader(&local_23c8);
      DynamicValue::Reader::~Reader(&local_2448);
      local_2369 = false;
    }
  }
  DynamicList::Reader::operator[](&local_2530,(Reader *)local_2218,1);
  DynamicValue::Reader::as<capnp::DynamicStruct>(&local_24e8,&local_2530);
  kj::StringPtr::StringPtr((StringPtr *)auStack_2540,"textField");
  DynamicStruct::Reader::get(&local_24b0,&local_24e8,(StringPtr)_auStack_2540);
  local_2468 = (ArrayPtr<const_char>)DynamicValue::Reader::as<capnp::Text>(&local_24b0);
  bVar1 = kj::operator==("x structlist 2",(StringPtr *)&local_2468);
  DynamicValue::Reader::~Reader(&local_24b0);
  DynamicValue::Reader::~Reader(&local_2530);
  if (!bVar1) {
    local_2541 = kj::_::Debug::shouldLog(ERROR);
    while (local_2541 != false) {
      DynamicList::Reader::operator[](&local_2620,(Reader *)local_2218,1);
      DynamicValue::Reader::as<capnp::DynamicStruct>(&local_25d8,&local_2620);
      kj::StringPtr::StringPtr((StringPtr *)&local_2630,"textField");
      DynamicStruct::Reader::get(&local_25a0,&local_25d8,(StringPtr)local_2630);
      AVar15 = (ArrayPtr<const_char>)DynamicValue::Reader::as<capnp::Text>(&local_25a0);
      local_2558 = AVar15;
      kj::_::Debug::log<char_const(&)[121],char_const(&)[15],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x18b,ERROR,
                 "\"failed: expected \" \"(\\\"x structlist 2\\\") == (listReader[1].template as<DynamicStruct>().get(\\\"textField\\\").template as<Text>())\", \"x structlist 2\", listReader[1].template as<DynamicStruct>().get(\"textField\").template as<Text>()"
                 ,(char (*) [121])
                  "failed: expected (\"x structlist 2\") == (listReader[1].template as<DynamicStruct>().get(\"textField\").template as<Text>())"
                 ,(char (*) [15])"x structlist 2",(Reader *)&local_2558);
      DynamicValue::Reader::~Reader(&local_25a0);
      DynamicValue::Reader::~Reader(&local_2620);
      local_2541 = false;
    }
  }
  DynamicList::Reader::operator[](&local_2708,(Reader *)local_2218,2);
  DynamicValue::Reader::as<capnp::DynamicStruct>(&local_26c0,&local_2708);
  kj::StringPtr::StringPtr((StringPtr *)auStack_2718,"textField");
  DynamicStruct::Reader::get(&local_2688,&local_26c0,(StringPtr)_auStack_2718);
  local_2640 = (ArrayPtr<const_char>)DynamicValue::Reader::as<capnp::Text>(&local_2688);
  bVar1 = kj::operator==("x structlist 3",(StringPtr *)&local_2640);
  DynamicValue::Reader::~Reader(&local_2688);
  DynamicValue::Reader::~Reader(&local_2708);
  if (!bVar1) {
    local_2719 = kj::_::Debug::shouldLog(ERROR);
    while (local_2719 != false) {
      DynamicList::Reader::operator[](&local_27f8,(Reader *)local_2218,2);
      DynamicValue::Reader::as<capnp::DynamicStruct>(&local_27b0,&local_27f8);
      kj::StringPtr::StringPtr((StringPtr *)&local_2808,"textField");
      DynamicStruct::Reader::get(&local_2778,&local_27b0,(StringPtr)local_2808);
      AVar15 = (ArrayPtr<const_char>)DynamicValue::Reader::as<capnp::Text>(&local_2778);
      local_2730 = AVar15;
      kj::_::Debug::log<char_const(&)[121],char_const(&)[15],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x18c,ERROR,
                 "\"failed: expected \" \"(\\\"x structlist 3\\\") == (listReader[2].template as<DynamicStruct>().get(\\\"textField\\\").template as<Text>())\", \"x structlist 3\", listReader[2].template as<DynamicStruct>().get(\"textField\").template as<Text>()"
                 ,(char (*) [121])
                  "failed: expected (\"x structlist 3\") == (listReader[2].template as<DynamicStruct>().get(\"textField\").template as<Text>())"
                 ,(char (*) [15])"x structlist 3",(Reader *)&local_2730);
      DynamicValue::Reader::~Reader(&local_2778);
      DynamicValue::Reader::~Reader(&local_27f8);
      local_2719 = false;
    }
  }
  kj::StringPtr::StringPtr(&local_2860,"enumList");
  name_10.content.size_ = local_2860.content.size_;
  name_10.content.ptr = local_2860.content.ptr;
  DynamicStruct::Reader::get(&local_2850,(Reader *)local_b30,name_10);
  auStack_2880._8_8_ = "grault";
  local_2888 = "qux";
  auStack_2880._0_8_ = (long)"\"failed: expected \" \"(\\\"foo\\\") == (bar)\", \"foo\", bar" + 0x31
  ;
  auStack_2880._16_8_ = &local_2888;
  auStack_2880._24_8_ = (CapTableReader *)0x3;
  expected_13._M_len = local_2860.content.size_;
  expected_13._M_array = (iterator)0x3;
  checkEnumList<capnp::DynamicValue::Reader>
            ((anon_unknown_130 *)&local_2850,(Reader *)auStack_2880._16_8_,expected_13);
  DynamicValue::Reader::~Reader(&local_2850);
  kj::StringPtr::StringPtr((StringPtr *)&local_2900,"enumField");
  DynamicStruct::Reader::get(&local_28f0,(Reader *)&stack0x00000008,(StringPtr)local_2900);
  RVar17 = DynamicValue::Reader::as<capnp::DynamicEnum>(&local_28f0);
  e_01._8_8_ = RVar17._8_8_;
  SStack_2910.raw = (RawBrandedSchema *)RVar17.schema.super_Schema.raw;
  local_2908 = RVar17.value;
  local_28a0 = CONCAT22(local_28a0._2_2_,local_2908);
  e_01.schema.super_Schema.raw._4_4_ = 0;
  e_01.schema.super_Schema.raw._0_4_ = local_28a0;
  local_28a8.raw = SStack_2910.raw;
  local_2898 = (ArrayPtr<const_char>)
               anon_unknown_130::name((anon_unknown_130 *)SStack_2910.raw,e_01);
  bVar1 = kj::operator==("corge",(StringPtr *)&local_2898);
  DynamicValue::Reader::~Reader(&local_28f0);
  if (!bVar1) {
    local_2911 = kj::_::Debug::shouldLog(ERROR);
    while (local_2911 != false) {
      kj::StringPtr::StringPtr((StringPtr *)&local_2990,"enumField");
      DynamicStruct::Reader::get(&local_2980,(Reader *)&stack0x00000008,(StringPtr)local_2990);
      RVar17 = DynamicValue::Reader::as<capnp::DynamicEnum>(&local_2980);
      e_02._8_8_ = RVar17._8_8_;
      local_29a0.raw = (RawBrandedSchema *)RVar17.schema.super_Schema.raw;
      local_2998 = RVar17.value;
      local_2930 = CONCAT22(local_2930._2_2_,local_2998);
      e_02.schema.super_Schema.raw._4_4_ = 0;
      e_02.schema.super_Schema.raw._0_4_ = local_2930;
      local_2938.raw = local_29a0.raw;
      AVar15 = (ArrayPtr<const_char>)anon_unknown_130::name((anon_unknown_130 *)local_29a0.raw,e_02)
      ;
      local_2928 = AVar15;
      kj::_::Debug::log<char_const(&)[89],char_const(&)[6],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,400,ERROR,
                 "\"failed: expected \" \"(\\\"corge\\\") == (name(reader.get(\\\"enumField\\\").template as<DynamicEnum>()))\", \"corge\", name(reader.get(\"enumField\").template as<DynamicEnum>())"
                 ,(char (*) [89])
                  "failed: expected (\"corge\") == (name(reader.get(\"enumField\").template as<DynamicEnum>()))"
                 ,(char (*) [6])"corge",(Reader *)&local_2928);
      DynamicValue::Reader::~Reader(&local_2980);
      local_2911 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_2a38,"voidList");
  DynamicStruct::Reader::get(&local_2a28,(Reader *)&stack0x00000008,(StringPtr)_auStack_2a38);
  DynamicValue::Reader::as<capnp::DynamicList>(&local_29e0,&local_2a28);
  uVar9 = DynamicList::Reader::size(&local_29e0);
  DynamicValue::Reader::~Reader(&local_2a28);
  if (uVar9 != 6) {
    local_2a39 = kj::_::Debug::shouldLog(ERROR);
    while (local_2a39 != false) {
      local_2a40 = 6;
      kj::StringPtr::StringPtr((StringPtr *)&local_2ae0,"voidList");
      DynamicStruct::Reader::get(&local_2ad0,(Reader *)&stack0x00000008,(StringPtr)local_2ae0);
      DynamicValue::Reader::as<capnp::DynamicList>(&local_2a88,&local_2ad0);
      local_2a44 = DynamicList::Reader::size(&local_2a88);
      kj::_::Debug::log<char_const(&)[84],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x192,ERROR,
                 "\"failed: expected \" \"(6u) == (reader.get(\\\"voidList\\\").template as<DynamicList>().size())\", 6u, reader.get(\"voidList\").template as<DynamicList>().size()"
                 ,(char (*) [84])
                  "failed: expected (6u) == (reader.get(\"voidList\").template as<DynamicList>().size())"
                 ,&local_2a40,&local_2a44);
      DynamicValue::Reader::~Reader(&local_2ad0);
      local_2a39 = false;
    }
  }
  kj::StringPtr::StringPtr(&local_2b38,"boolList");
  name_09.content.size_ = local_2b38.content.size_;
  name_09.content.ptr = local_2b38.content.ptr;
  DynamicStruct::Reader::get(&local_2b28,(Reader *)&stack0x00000008,name_09);
  local_2b4c[0] = VOID;
  local_2b4c[1] = UNKNOWN >> 8;
  local_2b4c[2] = UNKNOWN >> 0x10;
  local_2b4c[3] = 1;
  local_2b4c._4_8_ = local_2b4c;
  local_2b4c._12_8_ = 4;
  expected_14._M_len = local_2b38.content.size_;
  expected_14._M_array = (iterator)0x4;
  checkList<bool,capnp::DynamicValue::Reader>
            ((_ *)&local_2b28,(Reader *)local_2b4c._4_8_,expected_14);
  DynamicValue::Reader::~Reader(&local_2b28);
  kj::StringPtr::StringPtr(&local_2ba8,"int8List");
  name_08.content.size_ = local_2ba8.content.size_;
  name_08.content.ptr = local_2ba8.content.ptr;
  DynamicStruct::Reader::get(&local_2b98,(Reader *)&stack0x00000008,name_08);
  local_2bba[0] = 0x6f;
  local_2bba[1] = 0x91;
  local_2bba._2_8_ = local_2bba;
  local_2bba._10_8_ = 2;
  expected_15._M_len = local_2ba8.content.size_;
  expected_15._M_array = (iterator)0x2;
  checkList<signed_char,capnp::DynamicValue::Reader>
            ((_ *)&local_2b98,(Reader *)local_2bba._2_8_,expected_15);
  DynamicValue::Reader::~Reader(&local_2b98);
  kj::StringPtr::StringPtr(&local_2c18,"int16List");
  name_07.content.size_ = local_2c18.content.size_;
  name_07.content.ptr = local_2c18.content.ptr;
  DynamicStruct::Reader::get(&local_2c08,(Reader *)&stack0x00000008,name_07);
  local_2c2c._0_2_ = 0x2b67;
  local_2c2c._2_2_ = 0xd499;
  local_2c2c._4_8_ = local_2c2c;
  local_2c2c._12_8_ = 2;
  expected_16._M_len = local_2c18.content.size_;
  expected_16._M_array = (iterator)0x2;
  checkList<short,capnp::DynamicValue::Reader>
            ((_ *)&local_2c08,(Reader *)local_2c2c._4_8_,expected_16);
  DynamicValue::Reader::~Reader(&local_2c08);
  kj::StringPtr::StringPtr((StringPtr *)(local_2ca0 + 0x18),"int32List");
  name_06.content.size_ = local_2ca0._32_8_;
  name_06.content.ptr = (char *)local_2ca0._24_8_;
  DynamicStruct::Reader::get(&local_2c78,(Reader *)&stack0x00000008,name_06);
  local_2ca0._0_4_ = 0x69f6bc7;
  local_2ca0._4_4_ = 0xf9609439;
  local_2ca0._8_8_ = local_2ca0;
  local_2ca0._16_8_ = 2;
  expected_17._M_len = local_2ca0._32_8_;
  expected_17._M_array = (iterator)0x2;
  checkList<int,capnp::DynamicValue::Reader>
            ((_ *)&local_2c78,(Reader *)local_2ca0._8_8_,expected_17);
  DynamicValue::Reader::~Reader(&local_2c78);
  kj::StringPtr::StringPtr((StringPtr *)(local_2d18 + 0x20),"int64List");
  name_05.content.size_ = local_2d18._40_8_;
  name_05.content.ptr = (char *)local_2d18._32_8_;
  DynamicStruct::Reader::get(&local_2ce8,(Reader *)&stack0x00000008,name_05);
  local_2d18._0_8_ = 0xf6b75ab2bc471c7;
  local_2d18._8_8_ = (char *)0xf0948a54d43b8e39;
  local_2d18._16_8_ = local_2d18;
  local_2d18._24_8_ = (SegmentReader *)0x2;
  expected_18._M_len = local_2d18._40_8_;
  expected_18._M_array = (iterator)0x2;
  checkList<long,capnp::DynamicValue::Reader>
            ((_ *)&local_2ce8,(Reader *)local_2d18._16_8_,expected_18);
  DynamicValue::Reader::~Reader(&local_2ce8);
  kj::StringPtr::StringPtr(&local_2d70,"uInt8List");
  name_04.content.size_ = local_2d70.content.size_;
  name_04.content.ptr = local_2d70.content.ptr;
  DynamicStruct::Reader::get(&local_2d60,(Reader *)&stack0x00000008,name_04);
  local_2d82[0] = 0x6f;
  local_2d82[1] = 0xde;
  local_2d82._2_8_ = local_2d82;
  local_2d82._10_8_ = 2;
  expected_19._M_len = local_2d70.content.size_;
  expected_19._M_array = (iterator)0x2;
  checkList<unsigned_char,capnp::DynamicValue::Reader>
            ((_ *)&local_2d60,(Reader *)local_2d82._2_8_,expected_19);
  DynamicValue::Reader::~Reader(&local_2d60);
  kj::StringPtr::StringPtr(&local_2de0,"uInt16List");
  name_03.content.size_ = local_2de0.content.size_;
  name_03.content.ptr = local_2de0.content.ptr;
  DynamicStruct::Reader::get(&local_2dd0,(Reader *)&stack0x00000008,name_03);
  local_2df4._0_2_ = 0x8235;
  local_2df4._2_2_ = 0xad9c;
  local_2df4._4_8_ = local_2df4;
  local_2df4._12_8_ = 2;
  expected_20._M_len = local_2de0.content.size_;
  expected_20._M_array = (iterator)0x2;
  checkList<unsigned_short,capnp::DynamicValue::Reader>
            ((_ *)&local_2dd0,(Reader *)local_2df4._4_8_,expected_20);
  DynamicValue::Reader::~Reader(&local_2dd0);
  kj::StringPtr::StringPtr(&local_2e50,"uInt32List");
  name_02.content.size_ = local_2e50.content.size_;
  name_02.content.ptr = local_2e50.content.ptr;
  DynamicStruct::Reader::get(&local_2e40,(Reader *)&stack0x00000008,name_02);
  local_2e64._0_4_ = 0xc6aea155;
  local_2e64._4_8_ = local_2e64;
  local_2e64._12_8_ = 1;
  expected_21._M_len = local_2e50.content.size_;
  expected_21._M_array = (iterator)0x1;
  checkList<unsigned_int,capnp::DynamicValue::Reader>
            ((_ *)&local_2e40,(Reader *)local_2e64._4_8_,expected_21);
  DynamicValue::Reader::~Reader(&local_2e40);
  kj::StringPtr::StringPtr(&local_2ec0,"uInt64List");
  name_01.content.size_ = local_2ec0.content.size_;
  name_01.content.ptr = local_2ec0.content.ptr;
  DynamicStruct::Reader::get(&local_2eb0,(Reader *)&stack0x00000008,name_01);
  listReader_1.reader.nestingLimit = -0x4a538e39;
  listReader_1.reader._44_4_ = 0x9a3298af;
  expected_22._M_len = local_2ec0.content.size_;
  expected_22._M_array = (iterator)0x1;
  checkList<unsigned_long,capnp::DynamicValue::Reader>
            ((_ *)&local_2eb0,(Reader *)&listReader_1.reader.nestingLimit,expected_22);
  DynamicValue::Reader::~Reader(&local_2eb0);
  kj::StringPtr::StringPtr((StringPtr *)&f_1,"float32List");
  DynamicStruct::Reader::get(&local_2f60,(Reader *)&stack0x00000008,(StringPtr)_f_1);
  DynamicValue::Reader::as<capnp::DynamicList>
            ((ReaderFor<capnp::DynamicList> *)local_2f18,&local_2f60);
  DynamicValue::Reader::~Reader(&local_2f60);
  uVar9 = DynamicList::Reader::size((Reader *)local_2f18);
  if (uVar9 != 4) {
    local_2f7c = 4;
    local_2f80 = DynamicList::Reader::size((Reader *)local_2f18);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              (&local_2f78,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x19e,FAILED,"(4u) == (listReader.size())","4u, listReader.size()",&local_2f7c,
               &local_2f80);
    kj::_::Debug::Fault::fatal(&local_2f78);
  }
  DynamicList::Reader::operator[]((Reader *)local_2fc8,(Reader *)local_2f18,0);
  RVar12 = DynamicValue::Reader::as<float>((Reader *)local_2fc8);
  DynamicValue::Reader::~Reader((Reader *)local_2fc8);
  if ((RVar12 != 5555.5) || (NAN(RVar12))) {
    local_2fc9 = kj::_::Debug::shouldLog(ERROR);
    while (local_2fc9 != false) {
      local_2fd0 = 5555.5;
      DynamicList::Reader::operator[](&local_3020,(Reader *)local_2f18,0);
      local_2fd4 = DynamicValue::Reader::as<float>(&local_3020);
      kj::_::Debug::log<char_const(&)[67],float,float>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x19f,ERROR,
                 "\"failed: expected \" \"(5555.5f) == (listReader[0].template as<float>())\", 5555.5f, listReader[0].template as<float>()"
                 ,(char (*) [67])
                  "failed: expected (5555.5f) == (listReader[0].template as<float>())",&local_2fd0,
                 &local_2fd4);
      DynamicValue::Reader::~Reader(&local_3020);
      local_2fc9 = false;
    }
  }
  fVar13 = kj::inf();
  DynamicList::Reader::operator[]((Reader *)local_3068,(Reader *)local_2f18,1);
  RVar12 = DynamicValue::Reader::as<float>((Reader *)local_3068);
  DynamicValue::Reader::~Reader((Reader *)local_3068);
  if ((fVar13 != RVar12) || (NAN(fVar13) || NAN(RVar12))) {
    local_3069 = kj::_::Debug::shouldLog(ERROR);
    while (local_3069 != false) {
      local_3070 = kj::inf();
      DynamicList::Reader::operator[](&local_30c0,(Reader *)local_2f18,1);
      local_3074 = DynamicValue::Reader::as<float>(&local_30c0);
      kj::_::Debug::log<char_const(&)[69],float,float>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1a0,ERROR,
                 "\"failed: expected \" \"(kj::inf()) == (listReader[1].template as<float>())\", kj::inf(), listReader[1].template as<float>()"
                 ,(char (*) [69])
                  "failed: expected (kj::inf()) == (listReader[1].template as<float>())",&local_3070
                 ,&local_3074);
      DynamicValue::Reader::~Reader(&local_30c0);
      local_3069 = false;
    }
  }
  fVar13 = kj::inf();
  DynamicList::Reader::operator[]((Reader *)local_3108,(Reader *)local_2f18,2);
  RVar12 = DynamicValue::Reader::as<float>((Reader *)local_3108);
  DynamicValue::Reader::~Reader((Reader *)local_3108);
  if ((-fVar13 != RVar12) || (NAN(-fVar13) || NAN(RVar12))) {
    local_3109 = kj::_::Debug::shouldLog(ERROR);
    while (local_3109 != false) {
      local_3110 = kj::inf();
      local_3110 = -local_3110;
      DynamicList::Reader::operator[](&local_3160,(Reader *)local_2f18,2);
      local_3114 = DynamicValue::Reader::as<float>(&local_3160);
      kj::_::Debug::log<char_const(&)[70],float,float>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1a1,ERROR,
                 "\"failed: expected \" \"(-kj::inf()) == (listReader[2].template as<float>())\", -kj::inf(), listReader[2].template as<float>()"
                 ,(char (*) [70])
                  "failed: expected (-kj::inf()) == (listReader[2].template as<float>())",
                 &local_3110,&local_3114);
      DynamicValue::Reader::~Reader(&local_3160);
      local_3109 = false;
    }
  }
  DynamicList::Reader::operator[]((Reader *)local_31a8,(Reader *)local_2f18,3);
  RVar12 = DynamicValue::Reader::as<float>((Reader *)local_31a8);
  bVar1 = isNaN(RVar12);
  DynamicValue::Reader::~Reader((Reader *)local_31a8);
  if (!bVar1) {
    listReader_2.reader._47_1_ = kj::_::Debug::shouldLog(ERROR);
    while (listReader_2.reader._47_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[59]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1a2,ERROR,"\"failed: expected \" \"isNaN(listReader[3].template as<float>())\"",
                 (char (*) [59])"failed: expected isNaN(listReader[3].template as<float>())");
      listReader_2.reader._47_1_ = 0;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)&f_2,"float64List");
  DynamicStruct::Reader::get(&local_3238,(Reader *)&stack0x00000008,(StringPtr)_f_2);
  DynamicValue::Reader::as<capnp::DynamicList>
            ((ReaderFor<capnp::DynamicList> *)local_31f0,&local_3238);
  DynamicValue::Reader::~Reader(&local_3238);
  uVar9 = DynamicList::Reader::size((Reader *)local_31f0);
  if (uVar9 != 4) {
    local_3254 = 4;
    local_3258 = DynamicList::Reader::size((Reader *)local_31f0);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              (&local_3250,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1a6,FAILED,"(4u) == (listReader.size())","4u, listReader.size()",&local_3254,
               &local_3258);
    kj::_::Debug::Fault::fatal(&local_3250);
  }
  DynamicList::Reader::operator[]((Reader *)local_32a0,(Reader *)local_31f0,0);
  RVar14 = DynamicValue::Reader::as<double>((Reader *)local_32a0);
  DynamicValue::Reader::~Reader((Reader *)local_32a0);
  if ((RVar14 != 7777.75) || (NAN(RVar14))) {
    local_32a1 = kj::_::Debug::shouldLog(ERROR);
    while (local_32a1 != false) {
      local_32b0 = 7777.75;
      DynamicList::Reader::operator[](&local_3300,(Reader *)local_31f0,0);
      local_32b8 = DynamicValue::Reader::as<double>(&local_3300);
      kj::_::Debug::log<char_const(&)[68],double,double>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1a7,ERROR,
                 "\"failed: expected \" \"(7777.75) == (listReader[0].template as<double>())\", 7777.75, listReader[0].template as<double>()"
                 ,(char (*) [68])
                  "failed: expected (7777.75) == (listReader[0].template as<double>())",&local_32b0,
                 &local_32b8);
      DynamicValue::Reader::~Reader(&local_3300);
      local_32a1 = false;
    }
  }
  fVar13 = kj::inf();
  DynamicList::Reader::operator[]((Reader *)local_3348,(Reader *)local_31f0,1);
  RVar14 = DynamicValue::Reader::as<double>((Reader *)local_3348);
  DynamicValue::Reader::~Reader((Reader *)local_3348);
  if (((double)fVar13 != RVar14) || (NAN((double)fVar13) || NAN(RVar14))) {
    local_3349 = kj::_::Debug::shouldLog(ERROR);
    while (local_3349 != false) {
      local_3350 = kj::inf();
      DynamicList::Reader::operator[](&local_33a0,(Reader *)local_31f0,1);
      local_3358 = DynamicValue::Reader::as<double>(&local_33a0);
      kj::_::Debug::log<char_const(&)[70],float,double>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1a8,ERROR,
                 "\"failed: expected \" \"(kj::inf()) == (listReader[1].template as<double>())\", kj::inf(), listReader[1].template as<double>()"
                 ,(char (*) [70])
                  "failed: expected (kj::inf()) == (listReader[1].template as<double>())",
                 &local_3350,&local_3358);
      DynamicValue::Reader::~Reader(&local_33a0);
      local_3349 = false;
    }
  }
  fVar13 = kj::inf();
  DynamicList::Reader::operator[]((Reader *)local_33e8,(Reader *)local_31f0,2);
  RVar14 = DynamicValue::Reader::as<double>((Reader *)local_33e8);
  DynamicValue::Reader::~Reader((Reader *)local_33e8);
  if (((double)-fVar13 != RVar14) || (NAN((double)-fVar13) || NAN(RVar14))) {
    local_33e9 = kj::_::Debug::shouldLog(ERROR);
    while (local_33e9 != false) {
      local_33f0 = kj::inf();
      local_33f0 = -local_33f0;
      DynamicList::Reader::operator[](&local_3440,(Reader *)local_31f0,2);
      local_33f8 = DynamicValue::Reader::as<double>(&local_3440);
      kj::_::Debug::log<char_const(&)[71],float,double>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1a9,ERROR,
                 "\"failed: expected \" \"(-kj::inf()) == (listReader[2].template as<double>())\", -kj::inf(), listReader[2].template as<double>()"
                 ,(char (*) [71])
                  "failed: expected (-kj::inf()) == (listReader[2].template as<double>())",
                 &local_33f0,&local_33f8);
      DynamicValue::Reader::~Reader(&local_3440);
      local_33e9 = false;
    }
  }
  DynamicList::Reader::operator[]((Reader *)local_3488,(Reader *)local_31f0,3);
  RVar14 = DynamicValue::Reader::as<double>((Reader *)local_3488);
  bVar1 = isNaN(RVar14);
  DynamicValue::Reader::~Reader((Reader *)local_3488);
  if (!bVar1) {
    local_3489 = kj::_::Debug::shouldLog(ERROR);
    while (local_3489 != false) {
      kj::_::Debug::log<char_const(&)[60]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1aa,ERROR,"\"failed: expected \" \"isNaN(listReader[3].template as<double>())\""
                 ,(char (*) [60])"failed: expected isNaN(listReader[3].template as<double>())");
      local_3489 = false;
    }
  }
  kj::StringPtr::StringPtr(&local_34e8,"textList");
  name_00.content.size_ = local_34e8.content.size_;
  name_00.content.ptr = local_34e8.content.ptr;
  DynamicStruct::Reader::get(&local_34d8,(Reader *)&stack0x00000008,name_00);
  Text::Reader::Reader((Reader *)local_3528,"plugh");
  Text::Reader::Reader((Reader *)(local_3528 + 0x10),"xyzzy");
  Text::Reader::Reader(local_3508,"thud");
  local_3508[1].super_StringPtr.content.ptr = local_3528;
  local_3508[1].super_StringPtr.content.size_ = 3;
  expected_23._M_len = local_34e8.content.size_;
  expected_23._M_array = (iterator)0x3;
  checkList<capnp::Text,capnp::DynamicValue::Reader>
            ((_ *)&local_34d8,(Reader *)local_3508[1].super_StringPtr.content.ptr,expected_23);
  DynamicValue::Reader::~Reader(&local_34d8);
  kj::StringPtr::StringPtr((StringPtr *)&local_3580,"dataList");
  DynamicStruct::Reader::get(&local_3570,(Reader *)&stack0x00000008,(StringPtr)local_3580);
  RVar18 = _::data("oops");
  listReader_3.reader._40_8_ = RVar18.super_ArrayPtr<const_unsigned_char>.ptr;
  _::data("exhausted");
  RVar18 = _::data("rfc3092");
  expected_24._M_len = RVar18.super_ArrayPtr<const_unsigned_char>.size_;
  expected_24._M_array = (iterator)0x3;
  checkList<capnp::Data,capnp::DynamicValue::Reader>
            ((_ *)&local_3570,(Reader *)&listReader_3.reader.nestingLimit,expected_24);
  DynamicValue::Reader::~Reader(&local_3570);
  kj::StringPtr::StringPtr((StringPtr *)&f_3,"structList");
  DynamicStruct::Reader::get(&local_3648,(Reader *)&stack0x00000008,(StringPtr)_f_3);
  DynamicValue::Reader::as<capnp::DynamicList>
            ((ReaderFor<capnp::DynamicList> *)local_3600,&local_3648);
  DynamicValue::Reader::~Reader(&local_3648);
  uVar9 = DynamicList::Reader::size((Reader *)local_3600);
  if (uVar9 != 3) {
    local_3664 = 3;
    local_3668 = DynamicList::Reader::size((Reader *)local_3600);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              (&local_3660,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1b0,FAILED,"(3u) == (listReader.size())","3u, listReader.size()",&local_3664,
               &local_3668);
    kj::_::Debug::Fault::fatal(&local_3660);
  }
  DynamicList::Reader::operator[](&local_3740,(Reader *)local_3600,0);
  DynamicValue::Reader::as<capnp::DynamicStruct>(&local_36f8,&local_3740);
  kj::StringPtr::StringPtr((StringPtr *)auStack_3750,"textField");
  DynamicStruct::Reader::get(&local_36c0,&local_36f8,(StringPtr)_auStack_3750);
  local_3678 = (ArrayPtr<const_char>)DynamicValue::Reader::as<capnp::Text>(&local_36c0);
  bVar1 = kj::operator==("structlist 1",(StringPtr *)&local_3678);
  DynamicValue::Reader::~Reader(&local_36c0);
  DynamicValue::Reader::~Reader(&local_3740);
  if (!bVar1) {
    local_3751 = kj::_::Debug::shouldLog(ERROR);
    while (local_3751 != false) {
      DynamicList::Reader::operator[](&local_3830,(Reader *)local_3600,0);
      DynamicValue::Reader::as<capnp::DynamicStruct>(&local_37e8,&local_3830);
      kj::StringPtr::StringPtr((StringPtr *)&local_3840,"textField");
      DynamicStruct::Reader::get(&local_37b0,&local_37e8,(StringPtr)local_3840);
      AVar15 = (ArrayPtr<const_char>)DynamicValue::Reader::as<capnp::Text>(&local_37b0);
      local_3768 = AVar15;
      kj::_::Debug::log<char_const(&)[119],char_const(&)[13],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1b1,ERROR,
                 "\"failed: expected \" \"(\\\"structlist 1\\\") == (listReader[0].template as<DynamicStruct>().get(\\\"textField\\\").template as<Text>())\", \"structlist 1\", listReader[0].template as<DynamicStruct>().get(\"textField\").template as<Text>()"
                 ,(char (*) [119])
                  "failed: expected (\"structlist 1\") == (listReader[0].template as<DynamicStruct>().get(\"textField\").template as<Text>())"
                 ,(char (*) [13])0x4cc378,(Reader *)&local_3768);
      DynamicValue::Reader::~Reader(&local_37b0);
      DynamicValue::Reader::~Reader(&local_3830);
      local_3751 = false;
    }
  }
  DynamicList::Reader::operator[](&local_3918,(Reader *)local_3600,1);
  DynamicValue::Reader::as<capnp::DynamicStruct>(&local_38d0,&local_3918);
  kj::StringPtr::StringPtr((StringPtr *)auStack_3928,"textField");
  DynamicStruct::Reader::get(&local_3898,&local_38d0,(StringPtr)_auStack_3928);
  local_3850 = (ArrayPtr<const_char>)DynamicValue::Reader::as<capnp::Text>(&local_3898);
  bVar1 = kj::operator==("structlist 2",(StringPtr *)&local_3850);
  DynamicValue::Reader::~Reader(&local_3898);
  DynamicValue::Reader::~Reader(&local_3918);
  if (!bVar1) {
    local_3929 = kj::_::Debug::shouldLog(ERROR);
    while (local_3929 != false) {
      DynamicList::Reader::operator[](&local_3a08,(Reader *)local_3600,1);
      DynamicValue::Reader::as<capnp::DynamicStruct>(&local_39c0,&local_3a08);
      kj::StringPtr::StringPtr((StringPtr *)&local_3a18,"textField");
      DynamicStruct::Reader::get(&local_3988,&local_39c0,(StringPtr)local_3a18);
      AVar15 = (ArrayPtr<const_char>)DynamicValue::Reader::as<capnp::Text>(&local_3988);
      local_3940 = AVar15;
      kj::_::Debug::log<char_const(&)[119],char_const(&)[13],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1b2,ERROR,
                 "\"failed: expected \" \"(\\\"structlist 2\\\") == (listReader[1].template as<DynamicStruct>().get(\\\"textField\\\").template as<Text>())\", \"structlist 2\", listReader[1].template as<DynamicStruct>().get(\"textField\").template as<Text>()"
                 ,(char (*) [119])
                  "failed: expected (\"structlist 2\") == (listReader[1].template as<DynamicStruct>().get(\"textField\").template as<Text>())"
                 ,(char (*) [13])0x4bd3b4,(Reader *)&local_3940);
      DynamicValue::Reader::~Reader(&local_3988);
      DynamicValue::Reader::~Reader(&local_3a08);
      local_3929 = false;
    }
  }
  DynamicList::Reader::operator[](&local_3af0,(Reader *)local_3600,2);
  DynamicValue::Reader::as<capnp::DynamicStruct>(&local_3aa8,&local_3af0);
  kj::StringPtr::StringPtr((StringPtr *)auStack_3b00,"textField");
  DynamicStruct::Reader::get(&local_3a70,&local_3aa8,(StringPtr)_auStack_3b00);
  local_3a28 = (ArrayPtr<const_char>)DynamicValue::Reader::as<capnp::Text>(&local_3a70);
  bVar1 = kj::operator==("structlist 3",(StringPtr *)&local_3a28);
  DynamicValue::Reader::~Reader(&local_3a70);
  DynamicValue::Reader::~Reader(&local_3af0);
  if (!bVar1) {
    local_3b01 = kj::_::Debug::shouldLog(ERROR);
    while (local_3b01 != false) {
      DynamicList::Reader::operator[](&local_3be0,(Reader *)local_3600,2);
      DynamicValue::Reader::as<capnp::DynamicStruct>(&local_3b98,&local_3be0);
      kj::StringPtr::StringPtr((StringPtr *)&local_3bf0,"textField");
      DynamicStruct::Reader::get(&local_3b60,&local_3b98,(StringPtr)local_3bf0);
      AVar15 = (ArrayPtr<const_char>)DynamicValue::Reader::as<capnp::Text>(&local_3b60);
      local_3b18 = AVar15;
      kj::_::Debug::log<char_const(&)[119],char_const(&)[13],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1b3,ERROR,
                 "\"failed: expected \" \"(\\\"structlist 3\\\") == (listReader[2].template as<DynamicStruct>().get(\\\"textField\\\").template as<Text>())\", \"structlist 3\", listReader[2].template as<DynamicStruct>().get(\"textField\").template as<Text>()"
                 ,(char (*) [119])
                  "failed: expected (\"structlist 3\") == (listReader[2].template as<DynamicStruct>().get(\"textField\").template as<Text>())"
                 ,(char (*) [13])0x4cc51c,(Reader *)&local_3b18);
      DynamicValue::Reader::~Reader(&local_3b60);
      DynamicValue::Reader::~Reader(&local_3be0);
      local_3b01 = false;
    }
  }
  kj::StringPtr::StringPtr(&local_3c48,"enumList");
  name.content.size_ = local_3c48.content.size_;
  name.content.ptr = local_3c48.content.ptr;
  DynamicStruct::Reader::get(&local_3c38,(Reader *)&stack0x00000008,name);
  local_3c68 = "foo";
  local_3c60 = "garply";
  local_3c58 = &local_3c68;
  local_3c50 = (SegmentReader *)0x2;
  expected_25._M_len = local_3c48.content.size_;
  expected_25._M_array = (iterator)0x2;
  checkEnumList<capnp::DynamicValue::Reader>
            ((anon_unknown_130 *)&local_3c38,(Reader *)local_3c58,expected_25);
  DynamicValue::Reader::~Reader(&local_3c38);
  return;
}

Assistant:

void dynamicCheckTestMessage(Reader reader) {
  EXPECT_EQ(VOID, reader.get("voidField").as<Void>());
  EXPECT_EQ(true, reader.get("boolField").as<bool>());
  EXPECT_EQ(-123, reader.get("int8Field").as<int8_t>());
  EXPECT_EQ(-12345, reader.get("int16Field").as<int16_t>());
  EXPECT_EQ(-12345678, reader.get("int32Field").as<int32_t>());
  EXPECT_EQ(-123456789012345ll, reader.get("int64Field").as<int64_t>());
  EXPECT_EQ(234u, reader.get("uInt8Field").as<uint8_t>());
  EXPECT_EQ(45678u, reader.get("uInt16Field").as<uint16_t>());
  EXPECT_EQ(3456789012u, reader.get("uInt32Field").as<uint32_t>());
  EXPECT_EQ(12345678901234567890ull, reader.get("uInt64Field").as<uint64_t>());
  EXPECT_FLOAT_EQ(1234.5f, reader.get("float32Field").as<float>());
  EXPECT_DOUBLE_EQ(-123e45, reader.get("float64Field").as<double>());
  EXPECT_EQ("foo", reader.get("textField").as<Text>());
  EXPECT_EQ(data("bar"), reader.get("dataField").as<Data>());
  {
    auto subReader = reader.get("structField").as<DynamicStruct>();
    EXPECT_EQ(VOID, subReader.get("voidField").as<Void>());
    EXPECT_EQ(true, subReader.get("boolField").as<bool>());
    EXPECT_EQ(-12, subReader.get("int8Field").as<int8_t>());
    EXPECT_EQ(3456, subReader.get("int16Field").as<int16_t>());
    EXPECT_EQ(-78901234, subReader.get("int32Field").as<int32_t>());
    EXPECT_EQ(56789012345678ll, subReader.get("int64Field").as<int64_t>());
    EXPECT_EQ(90u, subReader.get("uInt8Field").as<uint8_t>());
    EXPECT_EQ(1234u, subReader.get("uInt16Field").as<uint16_t>());
    EXPECT_EQ(56789012u, subReader.get("uInt32Field").as<uint32_t>());
    EXPECT_EQ(345678901234567890ull, subReader.get("uInt64Field").as<uint64_t>());
    EXPECT_FLOAT_EQ(-1.25e-10f, subReader.get("float32Field").as<float>());
    EXPECT_DOUBLE_EQ(345, subReader.get("float64Field").as<double>());
    EXPECT_EQ("baz", subReader.get("textField").as<Text>());
    EXPECT_EQ(data("qux"), subReader.get("dataField").as<Data>());
    {
      auto subSubReader = subReader.get("structField").as<DynamicStruct>();
      EXPECT_EQ("nested", subSubReader.get("textField").as<Text>());
      EXPECT_EQ("really nested", subSubReader.get("structField").as<DynamicStruct>()
                                             .get("textField").as<Text>());
    }
    EXPECT_EQ("baz", name(subReader.get("enumField").as<DynamicEnum>()));

    checkList<Void>(subReader.get("voidList"), {VOID, VOID, VOID});
    checkList<bool>(subReader.get("boolList"), {false, true, false, true, true});
    checkList<int8_t>(subReader.get("int8List"), {12, -34, -0x80, 0x7f});
    checkList<int16_t>(subReader.get("int16List"), {1234, -5678, -0x8000, 0x7fff});
    // gcc warns on -0x800... and the only work-around I could find was to do -0x7ff...-1.
    checkList<int32_t>(subReader.get("int32List"), {12345678, -90123456, -0x7fffffff-1, 0x7fffffff});
    checkList<int64_t>(subReader.get("int64List"), {123456789012345ll, -678901234567890ll, -0x7fffffffffffffffll-1, 0x7fffffffffffffffll});
    checkList<uint8_t>(subReader.get("uInt8List"), {12u, 34u, 0u, 0xffu});
    checkList<uint16_t>(subReader.get("uInt16List"), {1234u, 5678u, 0u, 0xffffu});
    checkList<uint32_t>(subReader.get("uInt32List"), {12345678u, 90123456u, 0u, 0xffffffffu});
    checkList<uint64_t>(subReader.get("uInt64List"), {123456789012345ull, 678901234567890ull, 0ull, 0xffffffffffffffffull});
    checkList<float>(subReader.get("float32List"), {0.0f, 1234567.0f, 1e37f, -1e37f, 1e-37f, -1e-37f});
    checkList<double>(subReader.get("float64List"), {0.0, 123456789012345.0, 1e306, -1e306, 1e-306, -1e-306});
    checkList<Text>(subReader.get("textList"), {"quux", "corge", "grault"});
    checkList<Data>(subReader.get("dataList"), {data("garply"), data("waldo"), data("fred")});
    {
      auto listReader = subReader.get("structList").as<DynamicList>();
      ASSERT_EQ(3u, listReader.size());
      EXPECT_EQ("x structlist 1", listReader[0].as<DynamicStruct>().get("textField").as<Text>());
      EXPECT_EQ("x structlist 2", listReader[1].as<DynamicStruct>().get("textField").as<Text>());
      EXPECT_EQ("x structlist 3", listReader[2].as<DynamicStruct>().get("textField").as<Text>());
    }
    checkEnumList(subReader.get("enumList"), {"qux", "bar", "grault"});
  }
  EXPECT_EQ("corge", name(reader.get("enumField").as<DynamicEnum>()));

  EXPECT_EQ(6u, reader.get("voidList").as<DynamicList>().size());
  checkList<bool>(reader.get("boolList"), {true, false, false, true});
  checkList<int8_t>(reader.get("int8List"), {111, -111});
  checkList<int16_t>(reader.get("int16List"), {11111, -11111});
  checkList<int32_t>(reader.get("int32List"), {111111111, -111111111});
  checkList<int64_t>(reader.get("int64List"), {1111111111111111111ll, -1111111111111111111ll});
  checkList<uint8_t>(reader.get("uInt8List"), {111u, 222u});
  checkList<uint16_t>(reader.get("uInt16List"), {33333u, 44444u});
  checkList<uint32_t>(reader.get("uInt32List"), {3333333333u});
  checkList<uint64_t>(reader.get("uInt64List"), {11111111111111111111ull});
  {
    auto listReader = reader.get("float32List").as<DynamicList>();
    ASSERT_EQ(4u, listReader.size());
    EXPECT_EQ(5555.5f, listReader[0].as<float>());
    EXPECT_EQ(kj::inf(), listReader[1].as<float>());
    EXPECT_EQ(-kj::inf(), listReader[2].as<float>());
    EXPECT_TRUE(isNaN(listReader[3].as<float>()));
  }
  {
    auto listReader = reader.get("float64List").as<DynamicList>();
    ASSERT_EQ(4u, listReader.size());
    EXPECT_EQ(7777.75, listReader[0].as<double>());
    EXPECT_EQ(kj::inf(), listReader[1].as<double>());
    EXPECT_EQ(-kj::inf(), listReader[2].as<double>());
    EXPECT_TRUE(isNaN(listReader[3].as<double>()));
  }
  checkList<Text>(reader.get("textList"), {"plugh", "xyzzy", "thud"});
  checkList<Data>(reader.get("dataList"), {data("oops"), data("exhausted"), data("rfc3092")});
  {
    auto listReader = reader.get("structList").as<DynamicList>();
    ASSERT_EQ(3u, listReader.size());
    EXPECT_EQ("structlist 1", listReader[0].as<DynamicStruct>().get("textField").as<Text>());
    EXPECT_EQ("structlist 2", listReader[1].as<DynamicStruct>().get("textField").as<Text>());
    EXPECT_EQ("structlist 3", listReader[2].as<DynamicStruct>().get("textField").as<Text>());
  }
  checkEnumList(reader.get("enumList"), {"foo", "garply"});
}